

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O1

void snapshot_concurrent_compaction_test(void)

{
  bool bVar1;
  fdb_kvs_handle *handle;
  fdb_status fVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 handle_00;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar8;
  __atomic_base<unsigned_long> metalen;
  uint extraout_EDX;
  long extraout_RDX;
  long extraout_RDX_00;
  fdb_kvs_handle *pfVar9;
  code *pcVar10;
  fdb_doc *ptr_handle;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paVar11;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 fconfig_00;
  timeval *ptVar12;
  timeval *__tv;
  fdb_config *fconfig_01;
  fdb_kvs_handle **ppfVar13;
  uint uVar14;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paVar15;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *__s;
  long lVar16;
  char *__s_00;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar17;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar18;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar19;
  char *pcVar20;
  ulong uVar21;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar22;
  uint uVar23;
  fdb_file_handle *pfVar24;
  fdb_kvs_config *pfVar25;
  fdb_kvs_handle **ppfVar26;
  ulong uVar27;
  btree *doc;
  char cVar28;
  long lVar29;
  char *pcVar30;
  fdb_kvs_config *config;
  char *pcVar31;
  uint *puVar32;
  fdb_config *fconfig_02;
  fdb_kvs_handle **ppfVar33;
  kvs_ops_stat *pkVar34;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paVar35;
  fdb_doc *doc_00;
  fdb_doc *pfVar36;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 doc_01;
  fdb_kvs_handle *pfVar37;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  cb_snapshot_args cb_args;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char bodybuf [256];
  char keybuf [256];
  fdb_kvs_handle *pfStack_55f8;
  fdb_kvs_handle *pfStack_55f0;
  fdb_file_handle *pfStack_55e8;
  fdb_iterator *pfStack_55e0;
  fdb_doc *pfStack_55d8;
  fdb_kvs_handle *pfStack_55d0;
  timeval tStack_55c8;
  fdb_kvs_config fStack_55b8;
  fdb_config fStack_55a0;
  fdb_config *pfStack_54a8;
  fdb_kvs_handle *pfStack_54a0;
  fdb_kvs_handle *pfStack_5498;
  fdb_file_handle *pfStack_5490;
  fdb_kvs_handle *pfStack_5488;
  char acStack_547f [15];
  filemgr *pfStack_5470;
  docio_handle *pdStack_5468;
  btreeblk_handle *pbStack_5460;
  size_t sStack_5458;
  filemgr *pfStack_5450;
  docio_handle *pdStack_5448;
  btreeblk_handle *pbStack_5440;
  timeval tStack_5438;
  undefined1 auStack_5428 [76];
  uint uStack_53dc;
  char *pcStack_52e8;
  atomic<unsigned_long> aStack_52e0;
  btree *pbStack_52d8;
  fdb_kvs_handle *pfStack_52d0;
  fdb_kvs_handle *pfStack_52c8;
  code *pcStack_52c0;
  uint uStack_52ac;
  fdb_txn *pfStack_52a8;
  fdb_kvs_handle *pfStack_52a0;
  fdb_iterator *pfStack_5298;
  fdb_snapshot_info_t *pfStack_5290;
  int iStack_5284;
  fdb_kvs_handle *pfStack_5280;
  fdb_kvs_handle *apfStack_5278 [3];
  uint64_t uStack_5260;
  fdb_kvs_config fStack_5258;
  char acStack_5240 [8];
  timeval tStack_5238;
  char acStack_5228 [256];
  btree bStack_5128;
  char acStack_50d8 [256];
  char acStack_4fd8 [256];
  fdb_config fStack_4ed8;
  fdb_kvs_handle **ppfStack_4de0;
  fdb_kvs_handle **ppfStack_4dd8;
  fdb_kvs_handle *pfStack_4dd0;
  fdb_kvs_handle **ppfStack_4dc8;
  fdb_kvs_handle *pfStack_4dc0;
  code *pcStack_4db8;
  fdb_kvs_handle **ppfStack_4db0;
  fdb_kvs_handle *pfStack_4da8;
  fdb_kvs_handle *apfStack_4da0 [9];
  fdb_kvs_config fStack_4d58;
  timeval tStack_4d40;
  fdb_kvs_handle *apfStack_4d30 [33];
  fdb_config fStack_4c28;
  fdb_kvs_handle *apfStack_4b30 [32];
  fdb_kvs_handle *apfStack_4a30 [32];
  fdb_kvs_handle afStack_4930 [15];
  fdb_config *pfStack_2928;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2920;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2918;
  fdb_config *pfStack_2910;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2908;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2900;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_28f0;
  fdb_file_handle *pfStack_28e8;
  fdb_iterator *pfStack_28e0;
  fdb_doc *pfStack_28d8;
  fdb_kvs_handle *pfStack_28d0;
  undefined1 auStack_28c7 [15];
  timeval tStack_28b8;
  undefined1 auStack_28a8 [72];
  fdb_config fStack_2860;
  timeval *ptStack_2768;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2760;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2758;
  fdb_config *pfStack_2750;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2748;
  int iStack_2734;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2730;
  fdb_file_handle *pfStack_2728;
  pthread_t pStack_2720;
  char acStack_2717 [15];
  void *pvStack_2708;
  char *pcStack_2700;
  fdb_config *pfStack_26f8;
  uint64_t uStack_26f0;
  timeval tStack_26e8;
  undefined1 auStack_26d8 [16];
  uint64_t uStack_26c8;
  fdb_config fStack_25e0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_24e0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_24d8;
  uint *puStack_24d0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_24c8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_24c0;
  timeval tStack_24b0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_24a0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2498;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2488;
  fdb_kvs_handle *pfStack_2480;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2478;
  fdb_file_handle *pfStack_2470;
  uint uStack_2464;
  fdb_kvs_config afStack_2460 [2];
  timeval tStack_2420;
  fdb_kvs_config fStack_2410;
  fdb_kvs_info fStack_23f0;
  undefined1 auStack_23c0 [32];
  undefined1 uStack_23a0;
  undefined1 uStack_2392;
  undefined8 uStack_2388;
  code *pcStack_2368;
  undefined4 uStack_2360;
  uint *puStack_2358;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_22c8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_22c0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_22b8;
  hbtrie_func_readkey *phStack_22b0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_22a8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_22a0;
  fdb_file_handle *pfStack_2290;
  uint uStack_2284;
  fdb_kvs_handle *pfStack_2280;
  fdb_kvs_handle *pfStack_2278;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2270;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aaStack_2268 [5];
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2240;
  char acStack_2238 [8];
  fdb_kvs_config fStack_2230;
  fdb_kvs_info fStack_2218;
  timeval tStack_21e8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aaStack_21d8 [5];
  btree *apbStack_21b0 [5];
  btree *apbStack_2188 [5];
  btree *apbStack_2160 [4];
  fdb_doc *pfStack_2140;
  char acStack_2138 [256];
  char acStack_2038 [256];
  char acStack_1f38 [256];
  fdb_config fStack_1e38;
  fdb_doc *pfStack_1d40;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1d38;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1d30;
  fdb_kvs_config *pfStack_1d28;
  fdb_doc *pfStack_1d20;
  code *pcStack_1d18;
  undefined1 auStack_1d00 [36];
  undefined4 uStack_1cdc;
  fdb_kvs_handle *pfStack_1cd8;
  fdb_doc **ppfStack_1cd0;
  timeval tStack_1cc8;
  fdb_kvs_config fStack_1cb8;
  fdb_doc afStack_1ca0 [3];
  char acStack_1ba0 [256];
  char acStack_1aa0 [264];
  fdb_config fStack_1998;
  fdb_doc *pfStack_18a0;
  size_t *psStack_1898;
  fdb_doc afStack_13f0 [15];
  fdb_kvs_handle *pfStack_f38;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_f30;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_f28;
  char *pcStack_f20;
  char *pcStack_f18;
  code *pcStack_f10;
  fdb_kvs_handle *pfStack_f00;
  int iStack_ef4;
  fdb_kvs_handle *pfStack_ef0;
  undefined1 auStack_ee8 [232];
  char acStack_e00 [8];
  char acStack_df8 [64];
  timeval tStack_db8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aaStack_da8 [5];
  btree *apbStack_d80 [5];
  btree *apbStack_d58 [5];
  btree *apbStack_d30 [5];
  fdb_config fStack_d08;
  fdb_kvs_info *pfStack_c10;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_c08;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_c00;
  fdb_kvs_handle **ppfStack_bf8;
  fdb_kvs_handle **ppfStack_bf0;
  code *pcStack_be8;
  fdb_file_handle *pfStack_bd0;
  uint uStack_bc4;
  fdb_kvs_handle *apfStack_bc0 [4];
  fdb_kvs_info fStack_ba0;
  fdb_kvs_config fStack_b70;
  char acStack_b58 [8];
  timeval tStack_b50;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aaStack_b40 [5];
  btree *apbStack_b18 [5];
  btree *apbStack_af0 [5];
  btree *apbStack_ac8 [5];
  char acStack_aa0 [256];
  char acStack_9a0 [256];
  char acStack_8a0 [256];
  fdb_config fStack_7a0;
  fdb_kvs_handle *pfStack_6a8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_6a0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_698;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paStack_690;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paStack_688;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paStack_680;
  uint uStack_66c;
  uint uStack_668;
  uint uStack_664;
  fdb_kvs_handle *pfStack_660;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paStack_658;
  long lStack_650;
  fdb_kvs_handle *pfStack_648;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_640;
  size_t sStack_638;
  fdb_kvs_handle *pfStack_630;
  timeval tStack_628;
  fdb_kvs_handle fStack_618;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_3e0;
  char *pcStack_3d8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_3d0;
  code *pcStack_3b8;
  undefined1 auStack_3b0 [104];
  fdb_kvs_config local_348;
  fdb_config local_330;
  char local_238 [256];
  kvs_info local_138 [11];
  
  auStack_3b0._32_8_ = (kvs_ops_stat *)0x119835;
  gettimeofday((timeval *)(auStack_3b0 + 0x58),(__timezone_ptr_t)0x0);
  auStack_3b0._32_8_ = (kvs_ops_stat *)0x11983a;
  memleak_start();
  auStack_3b0._32_8_ = (kvs_ops_stat *)0x119847;
  fdb_get_default_config();
  auStack_3b0._32_8_ = (kvs_ops_stat *)0x119854;
  fdb_get_default_kvs_config();
  local_330.compaction_cb_ctx = auStack_3b0 + 0x38;
  auStack_3b0._56_8_ = (btree *)0x0;
  auStack_3b0._64_8_ = (btree *)0x0;
  auStack_3b0._72_8_ = (filemgr *)0x0;
  local_330.wal_threshold = 0x80;
  local_330.flags = 1;
  local_330.compaction_cb = cb_snapshot;
  local_330.compaction_cb_mask = 0x11;
  auStack_3b0._32_8_ = (kvs_ops_stat *)0x11989d;
  system("rm -rf  mvcc_test* > errorlog.txt");
  auStack_3b0._32_8_ = (kvs_ops_stat *)0x1198b2;
  fdb_open((fdb_file_handle **)(auStack_3b0 + 0x28),"./mvcc_test1",&local_330);
  auStack_3b0._32_8_ = (kvs_ops_stat *)0x1198cc;
  fdb_kvs_open((fdb_file_handle *)auStack_3b0._40_8_,(fdb_kvs_handle **)(auStack_3b0 + 0x30),"db",
               &local_348);
  auStack_3b0._56_8_ = auStack_3b0._48_8_;
  pkVar34 = (kvs_ops_stat *)0x1;
  uVar27 = 0;
  do {
    auStack_3b0._32_8_ = (kvs_ops_stat *)0x11990b;
    sprintf((char *)local_138,"key%04d",uVar27);
    auStack_3b0._32_8_ = (kvs_ops_stat *)0x119921;
    sprintf(local_238,"body%04d_update%d",uVar27,uVar27 / 0x32);
    handle_00 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)auStack_3b0._48_8_;
    auStack_3b0._32_8_ = (kvs_ops_stat *)0x11992e;
    sVar5 = strlen((char *)local_138);
    auStack_3b0._32_8_ = (kvs_ops_stat *)0x11993a;
    sVar6 = strlen(local_238);
    auStack_3b0._32_8_ = (kvs_ops_stat *)0x11994f;
    aVar8 = handle_00;
    fVar2 = fdb_set_kv((fdb_kvs_handle *)handle_00.seqtree,local_138,(size_t)(sVar5 + 1),local_238,
                       sVar6 + 1);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      auStack_3b0._32_8_ = (kvs_ops_stat *)0x119a29;
      snapshot_concurrent_compaction_test();
LAB_00119a29:
      auStack_3b0._32_8_ = (kvs_ops_stat *)0x119a2e;
      snapshot_concurrent_compaction_test();
      goto LAB_00119a2e;
    }
    if ((int)((ulong)pkVar34 / 0x32) * 0x32 + -1 == (int)uVar27) {
      auStack_3b0._32_8_ = (kvs_ops_stat *)0x119979;
      aVar8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)auStack_3b0._40_8_;
      fVar2 = fdb_commit((fdb_file_handle *)auStack_3b0._40_8_,'\0');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00119a29;
    }
    uVar14 = (int)uVar27 + 1;
    uVar27 = (ulong)uVar14;
    pkVar34 = (kvs_ops_stat *)(ulong)((int)pkVar34 + 1);
  } while (uVar14 != 100);
  auStack_3b0._64_8_ = (btree *)0x200000064;
  auStack_3b0._72_4_ = 10;
  auStack_3b0._32_8_ = (kvs_ops_stat *)0x1199ba;
  _snapshot_check((fdb_kvs_handle *)auStack_3b0._48_8_,100,2);
  auStack_3b0._32_8_ = (kvs_ops_stat *)0x1199ca;
  aVar8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)auStack_3b0._40_8_;
  fVar2 = fdb_compact((fdb_file_handle *)auStack_3b0._40_8_,"./mvcc_test2");
  if (fVar2 == FDB_RESULT_SUCCESS) {
    auStack_3b0._32_8_ = (kvs_ops_stat *)0x1199d7;
    fdb_close((fdb_file_handle *)auStack_3b0._40_8_);
    auStack_3b0._32_8_ = (kvs_ops_stat *)0x1199dc;
    fdb_shutdown();
    auStack_3b0._32_8_ = (kvs_ops_stat *)0x1199e1;
    memleak_end();
    pcVar20 = "%s PASSED\n";
    if (snapshot_concurrent_compaction_test()::__test_pass != '\0') {
      pcVar20 = "%s FAILED\n";
    }
    auStack_3b0._32_8_ = (kvs_ops_stat *)0x119a12;
    fprintf(_stderr,pcVar20,"snapshot with concurrent compaction test");
    return;
  }
LAB_00119a2e:
  auStack_3b0._32_8_ = cb_snapshot;
  snapshot_concurrent_compaction_test();
  pfVar9 = (fdb_kvs_handle *)auStack_3b0;
  uVar21 = 0;
  pcStack_3b8 = (code *)0x119a51;
  auStack_3b0._16_8_ = (void *)(sVar5 + 1);
  auStack_3b0._24_8_ = local_138;
  auStack_3b0._32_8_ = pkVar34;
  gettimeofday((timeval *)auStack_3b0,(__timezone_ptr_t)0x0);
  iVar4 = *(int *)(auStack_3b0._48_8_ + 0x10);
  *(int *)(auStack_3b0._48_8_ + 0x10) = iVar4 + -1;
  if (iVar4 < 1) {
    return;
  }
  if (extraout_RDX == 0) {
    pcStack_3b8 = (code *)0x119a71;
    _snapshot_check((fdb_kvs_handle *)
                    ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)auStack_3b0._48_8_)->seqtree,
                    (int)*(bid_t *)(auStack_3b0._48_8_ + 8),
                    *(int *)((long)(auStack_3b0._48_8_ + 8) + 4));
    pcStack_3b8 = (code *)0x119a7c;
    _snapshot_update_docs((fdb_file_handle *)aVar8.seqtree,(cb_snapshot_args *)auStack_3b0._48_8_);
    pcStack_3b8 = (code *)0x119a8a;
    _snapshot_check((fdb_kvs_handle *)
                    ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)auStack_3b0._48_8_)->seqtree,
                    (int)*(bid_t *)(auStack_3b0._48_8_ + 8),
                    *(int *)((long)(auStack_3b0._48_8_ + 8) + 4));
    return;
  }
  pcStack_3b8 = _snapshot_check;
  cb_snapshot();
  aStack_3d0.seqtree = handle_00.seqtree;
  aStack_3e0.seqtree = (btree *)auStack_3b0._48_8_;
  paVar11 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x0;
  paStack_680 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119ac3;
  pcStack_3d8 = local_238;
  pcStack_3b8 = (code *)uVar27;
  gettimeofday(&tStack_628,(__timezone_ptr_t)0x0);
  uStack_66c = (uint)uVar21;
  uVar14 = (int)(((uint)(uVar21 >> 0x1f) & 1) + uStack_66c) >> 1;
  paVar15 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(ulong)uVar14;
  pfVar37 = &fStack_618;
  paStack_680 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119ae5;
  pfStack_648 = pfVar9;
  fdb_get_kvs_info(pfVar9,(fdb_kvs_info *)pfVar37);
  lStack_650 = (long)(int)uVar14;
  if (fStack_618.kvs_config.custom_cmp != (fdb_custom_cmp_variable)((int)extraout_EDX * lStack_650))
  {
    paStack_680 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119c61;
    _snapshot_check();
  }
  paStack_658 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(ulong)extraout_EDX;
  if ((int)extraout_EDX < 1) {
    paStack_658 = paVar11;
  }
  aVar8.seqtree = (btree *)0x0;
  while( true ) {
    paVar35 = paStack_658;
    if ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)aVar8.seqtree == paStack_658) {
      return;
    }
    aStack_640.seqtree = (btree *)&(aVar8.seqtree)->vsize;
    paStack_680 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119b35;
    pfVar9 = pfStack_648;
    fVar2 = fdb_snapshot_open(pfStack_648,&pfStack_660,(long)aStack_640.seqtree * lStack_650);
    uVar23 = (uint)pfVar9;
    pfVar9 = pfVar37;
    __s = paVar15;
    paStack_690 = paVar11;
    if (fVar2 != FDB_RESULT_SUCCESS) break;
    if (0 < (int)uStack_66c) {
      uStack_668 = aVar8._0_4_;
      uStack_664 = (uStack_668 - ((int)(uStack_668 - 1) >> 0x1f)) - 1 | 1;
      uStack_668 = uStack_668 & 0x7ffffffe;
      paVar35 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x0;
      do {
        iVar4 = (int)paVar35;
        if ((int)uVar14 <= iVar4 &&
            (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)aVar8.seqtree ==
            (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x0) break;
        uVar23 = uStack_664;
        if (iVar4 < (int)uVar14) {
          uVar23 = uStack_668;
        }
        __s = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)
              &fStack_618.config.min_block_reuse_filesize;
        paStack_680 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119baa;
        sprintf((char *)__s,"key%04d",paVar35);
        handle_00.seqtree = (btree *)&fStack_618.trie;
        paStack_680 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119bc8;
        sprintf((char *)handle_00.seqtree,"body%04d_update%d",paVar35,(ulong)uVar23);
        pfVar9 = pfStack_660;
        paStack_680 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119bd5;
        sVar5 = strlen((char *)__s);
        paStack_680 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119bee;
        fVar2 = fdb_get_kv(pfVar9,__s,sVar5 + 1,&pfStack_630,&sStack_638);
        pfVar37 = pfStack_630;
        if (fVar2 != FDB_RESULT_SUCCESS) {
          paStack_680 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119c6b;
          _snapshot_check();
LAB_00119c6b:
          uVar23 = (int)&fStack_618 + 0x30;
          paStack_680 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119c7b;
          _snapshot_check();
          paStack_690 = paVar15;
          goto LAB_00119c7b;
        }
        paStack_680 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119c07;
        iVar3 = bcmp(pfStack_630,handle_00.seqtree,sStack_638);
        pfVar9 = pfVar37;
        if (iVar3 != 0) goto LAB_00119c6b;
        paStack_680 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119c13;
        fdb_free_block(pfVar37);
        paVar35 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(ulong)(iVar4 + 1U);
        paVar11 = paVar15;
      } while (uStack_66c != iVar4 + 1U);
    }
    paStack_680 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119c2e;
    fVar2 = fdb_kvs_close(pfStack_660);
    aVar8 = aStack_640;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      paStack_680 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119c45;
      _snapshot_check();
      return;
    }
  }
LAB_00119c7b:
  paStack_680 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)rollback_to_zero_test;
  _snapshot_check();
  pcStack_be8 = (code *)0x119ca2;
  pfStack_6a8 = pfVar9;
  aStack_6a0 = aVar8;
  aStack_698 = handle_00;
  paStack_688 = paVar35;
  paStack_680 = __s;
  gettimeofday((timeval *)(acStack_b58 + 8),(__timezone_ptr_t)0x0);
  pcStack_be8 = (code *)0x119ca7;
  memleak_start();
  pcStack_be8 = (code *)0x119cb3;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_be8 = (code *)0x119cc3;
  fdb_get_default_config();
  pcStack_be8 = (code *)0x119ccd;
  fdb_get_default_kvs_config();
  fStack_7a0.buffercache_size = 0;
  fStack_7a0.wal_threshold = 0x400;
  fStack_7a0.flags = 1;
  fStack_7a0.compaction_threshold = '\0';
  pcStack_be8 = (code *)0x119d00;
  fStack_7a0.multi_kv_instances = (bool)(char)uVar23;
  fdb_open(&pfStack_bd0,"./mvcc_test1",&fStack_7a0);
  uStack_bc4 = uVar23;
  if (uVar23 == 0) {
    pcStack_be8 = (code *)0x119d6f;
    fdb_kvs_open_default(pfStack_bd0,apfStack_bc0,&fStack_b70);
    lVar16 = 1;
  }
  else {
    ppfVar13 = apfStack_bc0;
    aVar8.seqtree = (btree *)&fStack_b70;
    uVar27 = 0;
    do {
      pcStack_be8 = (code *)0x119d34;
      sprintf(acStack_b58,"kv%d",uVar27 & 0xffffffff);
      pcStack_be8 = (code *)0x119d47;
      fdb_kvs_open(pfStack_bd0,ppfVar13,acStack_b58,(fdb_kvs_config *)aVar8.seqtree);
      uVar27 = uVar27 + 1;
      ppfVar13 = ppfVar13 + 1;
    } while (uVar27 != 4);
    lVar16 = 4;
    handle_00 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x4;
  }
  ppfVar13 = (fdb_kvs_handle **)0x0;
  pcVar10 = logCallbackFunc;
  pcVar20 = "rollback_to_zero_test";
  do {
    pfVar9 = apfStack_bc0[(long)ppfVar13];
    pcStack_be8 = (code *)0x119d95;
    fVar2 = fdb_set_log_callback(pfVar9,logCallbackFunc,"rollback_to_zero_test");
    iVar4 = (int)pfVar9;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStack_be8 = (code *)0x11a31e;
      rollback_to_zero_test();
      goto LAB_0011a31e;
    }
    ppfVar13 = (fdb_kvs_handle **)((long)ppfVar13 + 1);
  } while ((fdb_kvs_handle **)lVar16 != ppfVar13);
  uVar27 = 0;
  do {
    pcStack_be8 = (code *)0x119dc4;
    sprintf(acStack_9a0,"key%d",uVar27 & 0xffffffff);
    pcStack_be8 = (code *)0x119de0;
    sprintf(acStack_aa0,"meta%d",uVar27 & 0xffffffff);
    pcStack_be8 = (code *)0x119dfc;
    sprintf(acStack_8a0,"body%d",uVar27 & 0xffffffff);
    pcStack_be8 = (code *)0x119e0f;
    sVar5 = strlen(acStack_9a0);
    pcStack_be8 = (code *)0x119e1a;
    sVar6 = strlen(acStack_aa0);
    pcStack_be8 = (code *)0x119e25;
    sVar7 = strlen(acStack_8a0);
    pcStack_be8 = (code *)0x119e4a;
    fdb_doc_create((fdb_doc **)&aaStack_b40[uVar27].seqtree,acStack_9a0,sVar5,acStack_aa0,sVar6,
                   acStack_8a0,sVar7);
    lVar29 = 0;
    do {
      pcStack_be8 = (code *)0x119e5a;
      fdb_set(apfStack_bc0[lVar29],(fdb_doc *)aaStack_b40[uVar27].seqtree);
      lVar29 = lVar29 + 1;
    } while (lVar16 != lVar29);
    uVar27 = uVar27 + 1;
  } while (uVar27 != 5);
  pcStack_be8 = (code *)0x119e7e;
  fdb_commit(pfStack_bd0,'\x01');
  uVar27 = 5;
  do {
    pcStack_be8 = (code *)0x119ea0;
    sprintf(acStack_9a0,"key%d",uVar27 & 0xffffffff);
    pcStack_be8 = (code *)0x119ebc;
    sprintf(acStack_aa0,"meta%d",uVar27 & 0xffffffff);
    pcStack_be8 = (code *)0x119ed8;
    sprintf(acStack_8a0,"body%d",uVar27 & 0xffffffff);
    pcStack_be8 = (code *)0x119eeb;
    sVar5 = strlen(acStack_9a0);
    pcStack_be8 = (code *)0x119ef6;
    sVar6 = strlen(acStack_aa0);
    pcStack_be8 = (code *)0x119f01;
    sVar7 = strlen(acStack_8a0);
    pcStack_be8 = (code *)0x119f26;
    fdb_doc_create((fdb_doc **)&aaStack_b40[uVar27].seqtree,acStack_9a0,sVar5,acStack_aa0,sVar6,
                   acStack_8a0,sVar7);
    lVar29 = 0;
    do {
      pcStack_be8 = (code *)0x119f37;
      fdb_set(apfStack_bc0[lVar29],(fdb_doc *)aaStack_b40[uVar27].seqtree);
      lVar29 = lVar29 + 1;
    } while (lVar16 != lVar29);
    uVar27 = uVar27 + 1;
  } while (uVar27 != 10);
  pcStack_be8 = (code *)0x119f58;
  fdb_commit(pfStack_bd0,'\0');
  uVar27 = 10;
  do {
    pcStack_be8 = (code *)0x119f7a;
    sprintf(acStack_9a0,"key%d",uVar27 & 0xffffffff);
    pcStack_be8 = (code *)0x119f96;
    sprintf(acStack_aa0,"meta%d",uVar27 & 0xffffffff);
    pcStack_be8 = (code *)0x119fb2;
    sprintf(acStack_8a0,"body%d",uVar27 & 0xffffffff);
    pcStack_be8 = (code *)0x119fc5;
    sVar5 = strlen(acStack_9a0);
    pcStack_be8 = (code *)0x119fd0;
    sVar6 = strlen(acStack_aa0);
    pcStack_be8 = (code *)0x119fdb;
    sVar7 = strlen(acStack_8a0);
    pcStack_be8 = (code *)0x11a000;
    fdb_doc_create((fdb_doc **)&aaStack_b40[uVar27].seqtree,acStack_9a0,sVar5,acStack_aa0,sVar6,
                   acStack_8a0,sVar7);
    lVar29 = 0;
    do {
      pcStack_be8 = (code *)0x11a011;
      fdb_set(apfStack_bc0[lVar29],(fdb_doc *)aaStack_b40[uVar27].seqtree);
      lVar29 = lVar29 + 1;
    } while (lVar16 != lVar29);
    uVar27 = uVar27 + 1;
  } while (uVar27 != 0xf);
  pcStack_be8 = (code *)0x11a035;
  fdb_commit(pfStack_bd0,'\x01');
  uVar27 = 0xf;
  do {
    pcStack_be8 = (code *)0x11a057;
    sprintf(acStack_9a0,"key%d",uVar27 & 0xffffffff);
    pcStack_be8 = (code *)0x11a073;
    sprintf(acStack_aa0,"meta%d",uVar27 & 0xffffffff);
    pcStack_be8 = (code *)0x11a08f;
    sprintf(acStack_8a0,"body%d",uVar27 & 0xffffffff);
    aVar8.seqtree = (btree *)(aaStack_b40 + uVar27);
    pcStack_be8 = (code *)0x11a0a2;
    sVar5 = strlen(acStack_9a0);
    pcStack_be8 = (code *)0x11a0ad;
    handle_00 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)strlen(acStack_aa0);
    pcStack_be8 = (code *)0x11a0b8;
    sVar6 = strlen(acStack_8a0);
    pcStack_be8 = (code *)0x11a0dd;
    fdb_doc_create((fdb_doc **)aVar8.seqtree,acStack_9a0,sVar5,acStack_aa0,(size_t)handle_00,
                   acStack_8a0,sVar6);
    ppfVar13 = (fdb_kvs_handle **)0x0;
    do {
      pcStack_be8 = (code *)0x11a0ee;
      fdb_set(apfStack_bc0[(long)ppfVar13],
              (fdb_doc *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)&(aVar8.seqtree)->ksize)->seqtree);
      ppfVar13 = (fdb_kvs_handle **)((long)ppfVar13 + 1);
    } while ((fdb_kvs_handle **)lVar16 != ppfVar13);
    uVar27 = uVar27 + 1;
  } while (uVar27 != 0x14);
  pcStack_be8 = (code *)0x11a10f;
  fdb_commit(pfStack_bd0,'\0');
  pcVar10 = (code *)(ulong)uStack_bc4;
  if ((char)uStack_bc4 != '\0') {
    aVar8.seqtree = (btree *)&fStack_ba0.doc_count;
    handle_00.seqtree = (btree *)&fStack_ba0.space_used;
    pcVar10 = (code *)(apfStack_bc0 + 4);
    pcVar20 = (char *)apfStack_bc0;
    do {
      ppfVar13 = (fdb_kvs_handle **)pcVar20;
      pcStack_be8 = (code *)0x11a13c;
      ppfVar33 = ppfVar13;
      fVar2 = fdb_rollback(ppfVar13,0);
      iVar4 = (int)ppfVar33;
      pcVar20 = (char *)ppfVar13;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a323;
      pfVar9 = *ppfVar13;
      pcStack_be8 = (code *)0x11a152;
      fVar2 = fdb_get_kvs_info(pfVar9,(fdb_kvs_info *)pcVar10);
      iVar4 = (int)pfVar9;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a31e;
      if (fStack_ba0.last_seqnum != 0) {
        pcStack_be8 = (code *)0x11a1bb;
        rollback_to_zero_test();
      }
      if (fStack_ba0.doc_count != 0) {
        pcStack_be8 = (code *)0x11a1c5;
        rollback_to_zero_test();
      }
      if (fStack_ba0.space_used != 0) {
        pcStack_be8 = (code *)0x11a1cf;
        rollback_to_zero_test();
      }
      pfVar9 = *ppfVar13;
      pcStack_be8 = (code *)0x11a182;
      fVar2 = fdb_get(pfVar9,(fdb_doc *)aaStack_b40[0].seqtree);
      iVar4 = (int)pfVar9;
      if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0011a32d;
      pfVar9 = *ppfVar13;
      pcStack_be8 = (code *)0x11a19b;
      fVar2 = fdb_set(pfVar9,(fdb_doc *)aaStack_b40[0].seqtree);
      iVar4 = (int)pfVar9;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a328;
      pcVar20 = (char *)(ppfVar13 + 1);
      lVar16 = lVar16 + -1;
    } while (lVar16 != 0);
LAB_0011a267:
    pcStack_be8 = (code *)0x11a276;
    pfVar24 = pfStack_bd0;
    fVar2 = fdb_commit(pfStack_bd0,'\x01');
    iVar4 = (int)pfVar24;
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_be8 = (code *)0x11a288;
      fdb_close(pfStack_bd0);
      lVar16 = 0;
      do {
        pcStack_be8 = (code *)0x11a297;
        fdb_doc_free((fdb_doc *)aaStack_b40[lVar16].seqtree);
        lVar16 = lVar16 + 1;
      } while (lVar16 != 0x14);
      pcStack_be8 = (code *)0x11a2a5;
      fdb_shutdown();
      pcStack_be8 = (code *)0x11a2aa;
      memleak_end();
      pcVar20 = "single kv mode:";
      if ((char)uStack_bc4 != '\0') {
        pcVar20 = "multiple kv mode:";
      }
      pcStack_be8 = (code *)0x11a2da;
      sprintf(acStack_8a0,"rollback to zero test %s",pcVar20);
      pcVar20 = "%s PASSED\n";
      if (rollback_to_zero_test(bool)::__test_pass != '\0') {
        pcVar20 = "%s FAILED\n";
      }
      pcStack_be8 = (code *)0x11a307;
      fprintf(_stderr,pcVar20,acStack_8a0);
      return;
    }
    goto LAB_0011a332;
  }
  ppfVar33 = apfStack_bc0;
  pcStack_be8 = (code *)0x11a1dd;
  fVar2 = fdb_rollback(ppfVar33,0);
  iVar4 = (int)ppfVar33;
  pcVar20 = (char *)0x14;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a337;
  pcStack_be8 = (code *)0x11a1f4;
  pfVar9 = apfStack_bc0[0];
  fVar2 = fdb_get_kvs_info(apfStack_bc0[0],(fdb_kvs_info *)(apfStack_bc0 + 4));
  iVar4 = (int)pfVar9;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a33c;
  if (fStack_ba0.last_seqnum != 0) {
    pcStack_be8 = (code *)0x11a20e;
    rollback_to_zero_test();
  }
  if (fStack_ba0.doc_count != 0) {
    pcStack_be8 = (code *)0x11a220;
    rollback_to_zero_test();
  }
  if (fStack_ba0.space_used != 0) {
    pcStack_be8 = (code *)0x11a232;
    rollback_to_zero_test();
  }
  pcStack_be8 = (code *)0x11a244;
  pfVar9 = apfStack_bc0[0];
  fVar2 = fdb_get(apfStack_bc0[0],(fdb_doc *)aaStack_b40[0].seqtree);
  iVar4 = (int)pfVar9;
  if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0011a341;
  pcStack_be8 = (code *)0x11a25f;
  fVar2 = fdb_set(apfStack_bc0[0],(fdb_doc *)aaStack_b40[0].seqtree);
  iVar4 = (int)apfStack_bc0[0];
  if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011a267;
  goto LAB_0011a346;
LAB_0011a977:
  pcStack_f10 = (code *)0x11a97c;
  rollback_to_zero_after_compact_test();
LAB_0011a97c:
  pcStack_f10 = (code *)0x11a981;
  rollback_to_zero_after_compact_test();
LAB_0011a981:
  pcStack_f10 = (code *)0x11a986;
  rollback_to_zero_after_compact_test();
LAB_0011a986:
  pcStack_f10 = (code *)0x11a98b;
  rollback_to_zero_after_compact_test();
  goto LAB_0011a98b;
LAB_0011b672:
  aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b677;
  rollback_all_test();
LAB_0011b677:
  aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b67c;
  rollback_all_test();
LAB_0011b67c:
  aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b684;
  rollback_all_test();
  aVar22 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar10;
LAB_0011b684:
  aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b689;
  rollback_all_test();
LAB_0011b689:
  aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b68e;
  rollback_all_test();
LAB_0011b68e:
  aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b693;
  rollback_all_test();
LAB_0011b693:
  aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b698;
  rollback_all_test();
  goto LAB_0011b698;
LAB_0011be65:
  aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be6a;
  rollback_during_ops_test();
LAB_0011be6a:
  aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be6f;
  rollback_during_ops_test();
  goto LAB_0011be6f;
LAB_0011c266:
  aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c26b;
  in_memory_snapshot_rollback_test();
  goto LAB_0011c26b;
LAB_0011c67b:
  pcStack_4db8 = (code *)0x11c680;
  rollback_drop_multi_files_kvs_test();
LAB_0011c680:
  pcStack_4db8 = (code *)0x11c685;
  rollback_drop_multi_files_kvs_test();
LAB_0011c685:
  pcStack_4db8 = (code *)0x11c68a;
  rollback_drop_multi_files_kvs_test();
LAB_0011c68a:
  pcStack_4db8 = (code *)0x11c68f;
  rollback_drop_multi_files_kvs_test();
LAB_0011c68f:
  pcStack_4db8 = (code *)0x11c694;
  rollback_drop_multi_files_kvs_test();
LAB_0011c694:
  pcStack_4db8 = (code *)0x11c699;
  rollback_drop_multi_files_kvs_test();
LAB_0011c699:
  pcStack_4db8 = (code *)0x11c69e;
  rollback_drop_multi_files_kvs_test();
  goto LAB_0011c69e;
LAB_0011cbcd:
  pcStack_52c0 = (code *)0x11cbd2;
  rollback_without_seqtree();
  goto LAB_0011cbd2;
LAB_0011cf63:
  pfStack_5498 = (fdb_kvs_handle *)0x11cf68;
  tx_crash_recover_test();
LAB_0011cf68:
  pfStack_5498 = (fdb_kvs_handle *)0x11cf6d;
  tx_crash_recover_test();
  goto LAB_0011cf6d;
LAB_0011a31e:
  pcStack_be8 = (code *)0x11a323;
  rollback_to_zero_test();
LAB_0011a323:
  pcStack_be8 = (code *)0x11a328;
  rollback_to_zero_test();
LAB_0011a328:
  pcStack_be8 = (code *)0x11a32d;
  rollback_to_zero_test();
LAB_0011a32d:
  pcStack_be8 = (code *)0x11a332;
  rollback_to_zero_test();
LAB_0011a332:
  pcStack_be8 = (code *)0x11a337;
  rollback_to_zero_test();
LAB_0011a337:
  pcStack_be8 = (code *)0x11a33c;
  rollback_to_zero_test();
LAB_0011a33c:
  pcStack_be8 = (code *)0x11a341;
  rollback_to_zero_test();
LAB_0011a341:
  pcStack_be8 = (code *)0x11a346;
  rollback_to_zero_test();
LAB_0011a346:
  pcStack_be8 = rollback_to_zero_after_compact_test;
  rollback_to_zero_test();
  pcStack_f10 = (code *)0x11a36d;
  pfStack_c10 = (fdb_kvs_info *)pcVar10;
  aStack_c08 = aVar8;
  aStack_c00 = handle_00;
  ppfStack_bf8 = ppfVar13;
  ppfStack_bf0 = (fdb_kvs_handle **)pcVar20;
  pcStack_be8 = (code *)lVar16;
  gettimeofday(&tStack_db8,(__timezone_ptr_t)0x0);
  pcStack_f10 = (code *)0x11a379;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_f10 = (code *)0x11a389;
  fdb_get_default_config();
  pcStack_f10 = (code *)0x11a396;
  fdb_get_default_kvs_config();
  fStack_d08.buffercache_size = 0;
  fStack_d08.wal_threshold = 0x400;
  fStack_d08.flags = 1;
  fStack_d08.compaction_threshold = '\0';
  pcStack_f10 = (code *)0x11a3c9;
  fStack_d08.multi_kv_instances = (bool)(char)iVar4;
  fdb_open((fdb_file_handle **)&pfStack_f00,"./mvcc_test1",&fStack_d08);
  iStack_ef4 = iVar4;
  if (iVar4 == 0) {
    pcStack_f10 = (code *)0x11a43e;
    fdb_kvs_open_default
              ((fdb_file_handle *)pfStack_f00,(fdb_kvs_handle **)auStack_ee8,
               (fdb_kvs_config *)(auStack_ee8 + 0xd0));
    pcVar20 = (char *)0x1;
  }
  else {
    ppfVar13 = (fdb_kvs_handle **)auStack_ee8;
    aVar8.seqtree = (btree *)(auStack_ee8 + 0xd0);
    uVar27 = 0;
    do {
      pcStack_f10 = (code *)0x11a400;
      sprintf(acStack_e00,"kv%d",uVar27 & 0xffffffff);
      pcStack_f10 = (code *)0x11a413;
      fdb_kvs_open((fdb_file_handle *)pfStack_f00,ppfVar13,acStack_e00,
                   (fdb_kvs_config *)aVar8.seqtree);
      uVar27 = uVar27 + 1;
      ppfVar13 = ppfVar13 + 1;
    } while (uVar27 != 4);
    pcVar20 = (char *)0x4;
    handle_00 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x4;
  }
  pcVar31 = (char *)0x0;
  pcVar10 = logCallbackFunc;
  pcVar30 = "rollback_to_zero_after_compact_test";
  do {
    pfVar9 = *(fdb_kvs_handle **)(auStack_ee8 + (long)pcVar31 * 8);
    pcStack_f10 = (code *)0x11a464;
    fVar2 = fdb_set_log_callback(pfVar9,logCallbackFunc,"rollback_to_zero_after_compact_test");
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStack_f10 = (code *)0x11a977;
      rollback_to_zero_after_compact_test();
      goto LAB_0011a977;
    }
    pcVar31 = pcVar31 + 1;
  } while (pcVar20 != pcVar31);
  uVar27 = 0;
  do {
    pcStack_f10 = (code *)0x11a493;
    sprintf(auStack_ee8 + 0x90,"key%d",uVar27 & 0xffffffff);
    pcStack_f10 = (code *)0x11a4a9;
    sprintf(auStack_ee8 + 0x50,"meta%d",uVar27 & 0xffffffff);
    pcStack_f10 = (code *)0x11a4c2;
    sprintf(acStack_df8,"body%d",uVar27 & 0xffffffff);
    pcStack_f10 = (code *)0x11a4d5;
    sVar5 = strlen(auStack_ee8 + 0x90);
    pcStack_f10 = (code *)0x11a4e5;
    sVar6 = strlen(auStack_ee8 + 0x50);
    pcStack_f10 = (code *)0x11a4f5;
    sVar7 = strlen(acStack_df8);
    pcStack_f10 = (code *)0x11a51a;
    fdb_doc_create((fdb_doc **)&aaStack_da8[uVar27].seqtree,auStack_ee8 + 0x90,sVar5,
                   auStack_ee8 + 0x50,sVar6,acStack_df8,sVar7);
    lVar16 = 0;
    do {
      pcStack_f10 = (code *)0x11a52b;
      fdb_set(*(fdb_kvs_handle **)(auStack_ee8 + lVar16 * 8),(fdb_doc *)aaStack_da8[uVar27].seqtree)
      ;
      lVar16 = lVar16 + 1;
    } while (pcVar20 != (char *)lVar16);
    uVar27 = uVar27 + 1;
  } while (uVar27 != 5);
  pcStack_f10 = (code *)0x11a54f;
  fdb_commit((fdb_file_handle *)pfStack_f00,'\x01');
  uVar27 = 5;
  do {
    pcStack_f10 = (code *)0x11a571;
    sprintf(auStack_ee8 + 0x90,"key%d",uVar27 & 0xffffffff);
    pcStack_f10 = (code *)0x11a58a;
    sprintf(auStack_ee8 + 0x50,"meta%d",uVar27 & 0xffffffff);
    pcStack_f10 = (code *)0x11a5a6;
    sprintf(acStack_df8,"body%d",uVar27 & 0xffffffff);
    pcStack_f10 = (code *)0x11a5b9;
    sVar5 = strlen(auStack_ee8 + 0x90);
    pcStack_f10 = (code *)0x11a5c4;
    sVar6 = strlen(auStack_ee8 + 0x50);
    pcStack_f10 = (code *)0x11a5cf;
    sVar7 = strlen(acStack_df8);
    pcStack_f10 = (code *)0x11a5f1;
    fdb_doc_create((fdb_doc **)&aaStack_da8[uVar27].seqtree,auStack_ee8 + 0x90,sVar5,
                   auStack_ee8 + 0x50,sVar6,acStack_df8,sVar7);
    lVar16 = 0;
    do {
      pcStack_f10 = (code *)0x11a601;
      fdb_set(*(fdb_kvs_handle **)(auStack_ee8 + lVar16 * 8),(fdb_doc *)aaStack_da8[uVar27].seqtree)
      ;
      lVar16 = lVar16 + 1;
    } while (pcVar20 != (char *)lVar16);
    uVar27 = uVar27 + 1;
  } while (uVar27 != 10);
  pcStack_f10 = (code *)0x11a622;
  fdb_commit((fdb_file_handle *)pfStack_f00,'\0');
  uVar27 = 10;
  do {
    pcStack_f10 = (code *)0x11a644;
    sprintf(auStack_ee8 + 0x90,"key%d",uVar27 & 0xffffffff);
    pcStack_f10 = (code *)0x11a65d;
    sprintf(auStack_ee8 + 0x50,"meta%d",uVar27 & 0xffffffff);
    pcStack_f10 = (code *)0x11a679;
    sprintf(acStack_df8,"body%d",uVar27 & 0xffffffff);
    pcStack_f10 = (code *)0x11a68c;
    sVar5 = strlen(auStack_ee8 + 0x90);
    pcStack_f10 = (code *)0x11a697;
    sVar6 = strlen(auStack_ee8 + 0x50);
    pcStack_f10 = (code *)0x11a6a2;
    sVar7 = strlen(acStack_df8);
    pcStack_f10 = (code *)0x11a6c4;
    fdb_doc_create((fdb_doc **)&aaStack_da8[uVar27].seqtree,auStack_ee8 + 0x90,sVar5,
                   auStack_ee8 + 0x50,sVar6,acStack_df8,sVar7);
    lVar16 = 0;
    do {
      pcStack_f10 = (code *)0x11a6d4;
      fdb_set(*(fdb_kvs_handle **)(auStack_ee8 + lVar16 * 8),(fdb_doc *)aaStack_da8[uVar27].seqtree)
      ;
      lVar16 = lVar16 + 1;
    } while (pcVar20 != (char *)lVar16);
    uVar27 = uVar27 + 1;
  } while (uVar27 != 0xf);
  pcStack_f10 = (code *)0x11a6f8;
  fdb_commit((fdb_file_handle *)pfStack_f00,'\x01');
  uVar27 = 0xf;
  do {
    pcStack_f10 = (code *)0x11a71a;
    sprintf(auStack_ee8 + 0x90,"key%d",uVar27 & 0xffffffff);
    pcStack_f10 = (code *)0x11a733;
    sprintf(auStack_ee8 + 0x50,"meta%d",uVar27 & 0xffffffff);
    pcVar31 = acStack_df8;
    pcStack_f10 = (code *)0x11a74f;
    sprintf(pcVar31,"body%d",uVar27 & 0xffffffff);
    handle_00.seqtree = (btree *)(aaStack_da8 + uVar27);
    pcStack_f10 = (code *)0x11a762;
    sVar5 = strlen(auStack_ee8 + 0x90);
    pcStack_f10 = (code *)0x11a76d;
    aVar8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)strlen(auStack_ee8 + 0x50);
    pcStack_f10 = (code *)0x11a778;
    sVar6 = strlen(pcVar31);
    pcStack_f10 = (code *)0x11a79a;
    fdb_doc_create((fdb_doc **)handle_00.seqtree,auStack_ee8 + 0x90,sVar5,auStack_ee8 + 0x50,
                   (size_t)aVar8,pcVar31,sVar6);
    pcVar10 = (code *)0x0;
    do {
      pcStack_f10 = (code *)0x11a7aa;
      fdb_set(*(fdb_kvs_handle **)(auStack_ee8 + (long)pcVar10 * 8),
              (fdb_doc *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)&(handle_00.seqtree)->ksize)->
              seqtree);
      pcVar10 = (code *)((long)pcVar10 + 1);
    } while ((code *)pcVar20 != pcVar10);
    uVar27 = uVar27 + 1;
  } while (uVar27 != 0x14);
  pcStack_f10 = (code *)0x11a7cb;
  fdb_commit((fdb_file_handle *)pfStack_f00,'\0');
  pfVar9 = (fdb_kvs_handle *)&pfStack_ef0;
  pcStack_f10 = (code *)0x11a7e4;
  fVar2 = fdb_open((fdb_file_handle **)pfVar9,"./mvcc_test1",&fStack_d08);
  pcVar30 = (char *)0x14;
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_f10 = (code *)0x11a7fd;
    pfVar9 = pfStack_ef0;
    fVar2 = fdb_compact((fdb_file_handle *)pfStack_ef0,"./mvcc_test2");
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a990;
    pcStack_f10 = (code *)0x11a80f;
    fdb_close((fdb_file_handle *)pfStack_ef0);
    pcVar31 = auStack_ee8 + 0x30;
    aVar8.seqtree = (btree *)(auStack_ee8 + 0x40);
    pcVar20 = (char *)(ulong)(uint)((int)pcVar20 << 3);
    pcVar30 = (char *)0x0;
    handle_00.seqtree = (btree *)(auStack_ee8 + 0x20);
    do {
      pcVar10 = (code *)(auStack_ee8 + (long)pcVar30);
      pcStack_f10 = (code *)0x11a836;
      pfVar9 = (fdb_kvs_handle *)pcVar10;
      fVar2 = fdb_rollback((fdb_kvs_handle **)pcVar10,0);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a97c;
      pfVar9 = *(fdb_kvs_handle **)&((fdb_kvs_handle *)pcVar10)->kvs_config;
      pcStack_f10 = (code *)0x11a849;
      fVar2 = fdb_get_kvs_info(pfVar9,(fdb_kvs_info *)handle_00.seqtree);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a977;
      if ((hbtrie *)auStack_ee8._40_8_ != (hbtrie *)0x0) {
        pcStack_f10 = (code *)0x11a8af;
        rollback_to_zero_after_compact_test();
      }
      if ((btree *)auStack_ee8._48_8_ != (btree *)0x0) {
        pcStack_f10 = (code *)0x11a8b9;
        rollback_to_zero_after_compact_test();
      }
      if ((filemgr *)auStack_ee8._64_8_ != (filemgr *)0x0) {
        pcStack_f10 = (code *)0x11a8c3;
        rollback_to_zero_after_compact_test();
      }
      pfVar9 = *(fdb_kvs_handle **)&((fdb_kvs_handle *)pcVar10)->kvs_config;
      pcStack_f10 = (code *)0x11a879;
      fVar2 = fdb_get(pfVar9,(fdb_doc *)aaStack_da8[0].seqtree);
      if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0011a986;
      pfVar9 = *(fdb_kvs_handle **)&((fdb_kvs_handle *)pcVar10)->kvs_config;
      pcStack_f10 = (code *)0x11a892;
      fVar2 = fdb_set(pfVar9,(fdb_doc *)aaStack_da8[0].seqtree);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a981;
      pcVar30 = pcVar30 + 8;
    } while (pcVar20 != pcVar30);
    pcStack_f10 = (code *)0x11a8d4;
    pfVar9 = pfStack_f00;
    fVar2 = fdb_commit((fdb_file_handle *)pfStack_f00,'\x01');
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_f10 = (code *)0x11a8e6;
      fdb_close((fdb_file_handle *)pfStack_f00);
      lVar16 = 0;
      do {
        pcStack_f10 = (code *)0x11a8f5;
        fdb_doc_free((fdb_doc *)aaStack_da8[lVar16].seqtree);
        lVar16 = lVar16 + 1;
      } while (lVar16 != 0x14);
      pcStack_f10 = (code *)0x11a903;
      fdb_shutdown();
      pcVar20 = "single kv mode:";
      if ((char)iStack_ef4 != '\0') {
        pcVar20 = "multiple kv mode:";
      }
      pcStack_f10 = (code *)0x11a933;
      sprintf(acStack_df8,"rollback to zero after compact test %s",pcVar20);
      pcVar20 = "%s PASSED\n";
      if (rollback_to_zero_after_compact_test(bool)::__test_pass != '\0') {
        pcVar20 = "%s FAILED\n";
      }
      pcStack_f10 = (code *)0x11a960;
      fprintf(_stderr,pcVar20,acStack_df8);
      return;
    }
  }
  else {
LAB_0011a98b:
    pcStack_f10 = (code *)0x11a990;
    rollback_to_zero_after_compact_test();
LAB_0011a990:
    pcStack_f10 = (code *)0x11a995;
    rollback_to_zero_after_compact_test();
  }
  pcStack_f10 = rollback_to_wal_test;
  rollback_to_zero_after_compact_test();
  __s_00 = (char *)((ulong)pfVar9 & 0xffffffff);
  pcStack_1d18 = (code *)0x11a9b9;
  pfStack_f38 = (fdb_kvs_handle *)pcVar10;
  aStack_f30 = aVar8;
  aStack_f28 = handle_00;
  pcStack_f20 = pcVar30;
  pcStack_f18 = pcVar31;
  pcStack_f10 = (code *)pcVar20;
  gettimeofday(&tStack_1cc8,(__timezone_ptr_t)0x0);
  pcStack_1d18 = (code *)0x11a9be;
  memleak_start();
  pcStack_1d18 = (code *)0x11a9ca;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_1d18 = (code *)0x11a9da;
  fdb_get_default_config();
  config = &fStack_1cb8;
  pcStack_1d18 = (code *)0x11a9e7;
  fdb_get_default_kvs_config();
  fStack_1998.buffercache_size = 0;
  fStack_1998.wal_threshold = 0x100;
  fStack_1998.flags = 1;
  fStack_1998.compaction_threshold = '\0';
  uStack_1cdc = SUB84(pfVar9,0);
  fStack_1998.multi_kv_instances = SUB81(__s_00,0);
  doc_00 = (fdb_doc *)(auStack_1d00 + 0x18);
  pcStack_1d18 = (code *)0x11aa21;
  fdb_open((fdb_file_handle **)doc_00,"./mvcc_test8",&fStack_1998);
  ptr_handle = (fdb_doc *)auStack_1d00;
  pcStack_1d18 = (code *)0x11aa34;
  fdb_kvs_open_default((fdb_file_handle *)auStack_1d00._24_8_,(fdb_kvs_handle **)ptr_handle,config);
  pcStack_1d18 = (code *)0x11aa4a;
  fVar2 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_1d00._0_8_,logCallbackFunc,"rollback_to_wal_test");
  if (fVar2 == FDB_RESULT_SUCCESS) {
    lVar16 = 0;
    uVar27 = 0;
    do {
      pcStack_1d18 = (code *)0x11aa74;
      sprintf(acStack_1ba0,"key%d",uVar27 & 0xffffffff);
      pcStack_1d18 = (code *)0x11aa8d;
      sprintf(acStack_1aa0,"meta%d",uVar27 & 0xffffffff);
      pcStack_1d18 = (code *)0x11aaa3;
      sprintf((char *)afStack_1ca0,"body%d",uVar27 & 0xffffffff);
      pcStack_1d18 = (code *)0x11aab6;
      sVar5 = strlen(acStack_1ba0);
      pcStack_1d18 = (code *)0x11aac9;
      sVar6 = strlen(acStack_1aa0);
      pcStack_1d18 = (code *)0x11aad6;
      sVar7 = strlen((char *)afStack_1ca0);
      pcStack_1d18 = (code *)0x11aaf8;
      fdb_doc_create((fdb_doc **)((long)&pfStack_18a0 + lVar16),acStack_1ba0,sVar5,acStack_1aa0,
                     sVar6,afStack_1ca0,sVar7);
      pcStack_1d18 = (code *)0x11ab0a;
      fdb_set((fdb_kvs_handle *)auStack_1d00._0_8_,(&pfStack_18a0)[uVar27]);
      uVar27 = uVar27 + 1;
      lVar16 = lVar16 + 8;
    } while (uVar27 != 300);
    pcStack_1d18 = (code *)0x11ab2a;
    fdb_commit((fdb_file_handle *)auStack_1d00._24_8_,'\0');
    lVar16 = 0;
    uVar27 = 0;
    do {
      ppfStack_1cd0 = (fdb_doc **)((long)&pfStack_18a0 + lVar16);
      pcStack_1d18 = (code *)0x11ab4c;
      fdb_doc_free((&pfStack_18a0)[uVar27]);
      pcStack_1d18 = (code *)0x11ab68;
      sprintf(acStack_1ba0,"key%d",uVar27 & 0xffffffff);
      pcStack_1d18 = (code *)0x11ab84;
      sprintf(acStack_1aa0,"META%d",uVar27 & 0xffffffff);
      pcStack_1d18 = (code *)0x11ab9d;
      sprintf((char *)afStack_1ca0,"BODY%d",uVar27 & 0xffffffff);
      pcStack_1d18 = (code *)0x11aba5;
      sVar5 = strlen(acStack_1ba0);
      pcStack_1d18 = (code *)0x11abb0;
      sVar6 = strlen(acStack_1aa0);
      pcStack_1d18 = (code *)0x11abbb;
      sVar7 = strlen((char *)afStack_1ca0);
      pcStack_1d18 = (code *)0x11abdd;
      fdb_doc_create(ppfStack_1cd0,acStack_1ba0,sVar5,acStack_1aa0,sVar6,afStack_1ca0,sVar7);
      pcStack_1d18 = (code *)0x11abef;
      fdb_set((fdb_kvs_handle *)auStack_1d00._0_8_,(&pfStack_18a0)[uVar27]);
      uVar27 = uVar27 + 1;
      lVar16 = lVar16 + 8;
    } while (uVar27 != 0x96);
    pcStack_1d18 = (code *)0x11ac0f;
    fdb_commit((fdb_file_handle *)auStack_1d00._24_8_,'\0');
    uVar27 = 0x96;
    doc_00 = afStack_13f0;
    do {
      pcStack_1d18 = (code *)0x11ac25;
      fdb_doc_free((fdb_doc *)doc_00->keylen);
      pcStack_1d18 = (code *)0x11ac41;
      sprintf(acStack_1ba0,"key%d",uVar27 & 0xffffffff);
      __s_00 = acStack_1aa0;
      pcStack_1d18 = (code *)0x11ac5d;
      sprintf(__s_00,"Meta%d",uVar27 & 0xffffffff);
      ptr_handle = afStack_1ca0;
      pcStack_1d18 = (code *)0x11ac76;
      sprintf((char *)ptr_handle,"Body%d",uVar27 & 0xffffffff);
      pcStack_1d18 = (code *)0x11ac7e;
      aVar8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)strlen(acStack_1ba0);
      pcStack_1d18 = (code *)0x11ac89;
      handle_00 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)strlen(__s_00);
      pcStack_1d18 = (code *)0x11ac94;
      sVar5 = strlen((char *)ptr_handle);
      pcStack_1d18 = (code *)0x11acb4;
      fdb_doc_create((fdb_doc **)doc_00,acStack_1ba0,(size_t)aVar8,__s_00,(size_t)handle_00,
                     ptr_handle,sVar5);
      pcStack_1d18 = (code *)0x11acc1;
      fdb_set((fdb_kvs_handle *)auStack_1d00._0_8_,(fdb_doc *)doc_00->keylen);
      uVar27 = uVar27 + 1;
      doc_00 = (fdb_doc *)&doc_00->metalen;
    } while (uVar27 != 300);
    pcStack_1d18 = (code *)0x11ace1;
    fdb_commit((fdb_file_handle *)auStack_1d00._24_8_,'\0');
    pcStack_1d18 = (code *)0x11acf0;
    fVar2 = fdb_rollback((fdb_kvs_handle **)auStack_1d00,0x1c2);
    config = (fdb_kvs_config *)0x12c;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ae48;
    pcStack_1d18 = (code *)0x11ad21;
    fdb_doc_create((fdb_doc **)(auStack_1d00 + 0x10),(void *)psStack_1898[4],*psStack_1898,
                   (void *)0x0,0,(void *)0x0,0);
    pcStack_1d18 = (code *)0x11ad35;
    fVar2 = fdb_snapshot_open((fdb_kvs_handle *)auStack_1d00._0_8_,&pfStack_1cd8,0x1c2);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ae4d;
    pcStack_1d18 = (code *)0x11ad4c;
    fVar2 = fdb_get(pfStack_1cd8,(fdb_doc *)auStack_1d00._16_8_);
    pfVar36 = (fdb_doc *)auStack_1d00._16_8_;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ae52;
    ptr_handle = *(fdb_doc **)(auStack_1d00._16_8_ + 0x40);
    config = (fdb_kvs_config *)psStack_1898[8];
    pcStack_1d18 = (code *)0x11ad78;
    iVar4 = bcmp(ptr_handle,config,*(size_t *)(auStack_1d00._16_8_ + 0x10));
    if (iVar4 == 0) {
      if (*(uint64_t *)((long)pfVar36 + 0x28) != 0x12e) {
        pcStack_1d18 = (code *)0x11ad94;
        rollback_to_wal_test();
      }
      pcStack_1d18 = (code *)0x11ad9e;
      fdb_doc_free((fdb_doc *)auStack_1d00._16_8_);
      pcStack_1d18 = (code *)0x11ada8;
      fdb_kvs_close(pfStack_1cd8);
      pcStack_1d18 = (code *)0x11adb2;
      fdb_close((fdb_file_handle *)auStack_1d00._24_8_);
      lVar16 = 0;
      do {
        pcStack_1d18 = (code *)0x11adc1;
        fdb_doc_free((&pfStack_18a0)[lVar16]);
        lVar16 = lVar16 + 1;
      } while (lVar16 != 300);
      pcStack_1d18 = (code *)0x11add2;
      fdb_shutdown();
      pcStack_1d18 = (code *)0x11add7;
      memleak_end();
      pcVar20 = "single kv mode:";
      if ((char)uStack_1cdc != '\0') {
        pcVar20 = "multiple kv mode:";
      }
      pcStack_1d18 = (code *)0x11ae04;
      sprintf((char *)afStack_1ca0,"rollback to wal test %s",pcVar20);
      pcVar20 = "%s PASSED\n";
      if (rollback_to_wal_test(bool)::__test_pass != '\0') {
        pcVar20 = "%s FAILED\n";
      }
      pcStack_1d18 = (code *)0x11ae31;
      fprintf(_stderr,pcVar20,afStack_1ca0);
      return;
    }
  }
  else {
    pcStack_1d18 = (code *)0x11ae48;
    rollback_to_wal_test();
LAB_0011ae48:
    pcStack_1d18 = (code *)0x11ae4d;
    rollback_to_wal_test();
LAB_0011ae4d:
    pcStack_1d18 = (code *)0x11ae52;
    rollback_to_wal_test();
LAB_0011ae52:
    pfVar36 = doc_00;
    pcStack_1d18 = (code *)0x11ae57;
    rollback_to_wal_test();
  }
  pcStack_1d18 = rollback_all_test;
  pfVar25 = config;
  rollback_to_wal_test();
  aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ae87;
  pfStack_1d40 = ptr_handle;
  aStack_1d38 = aVar8;
  aStack_1d30 = handle_00;
  pfStack_1d28 = config;
  pfStack_1d20 = pfVar36;
  pcStack_1d18 = (code *)__s_00;
  gettimeofday(&tStack_21e8,(__timezone_ptr_t)0x0);
  aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ae8c;
  memleak_start();
  aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ae98;
  system("rm -rf  mvcc_test* > errorlog.txt");
  aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11aea8;
  fdb_get_default_config();
  aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11aeb2;
  fdb_get_default_kvs_config();
  fStack_1e38.buffercache_size._0_1_ = '\0';
  fStack_1e38.buffercache_size._1_1_ = '\0';
  fStack_1e38.buffercache_size._2_1_ = '\0';
  fStack_1e38.buffercache_size._3_1_ = '\0';
  fStack_1e38.buffercache_size._4_1_ = '\0';
  fStack_1e38.buffercache_size._5_1_ = '\0';
  fStack_1e38.buffercache_size._6_1_ = '\0';
  fStack_1e38.buffercache_size._7_1_ = '\0';
  fStack_1e38.wal_threshold._0_1_ = '\0';
  fStack_1e38.wal_threshold._1_1_ = '\x04';
  fStack_1e38.wal_threshold._2_1_ = '\0';
  fStack_1e38.wal_threshold._3_1_ = '\0';
  fStack_1e38.wal_threshold._4_1_ = '\0';
  fStack_1e38.wal_threshold._5_1_ = '\0';
  fStack_1e38.wal_threshold._6_1_ = '\0';
  fStack_1e38.wal_threshold._7_1_ = '\0';
  fStack_1e38.flags = 1;
  fStack_1e38.compaction_threshold = 0;
  fStack_1e38.block_reusing_threshold = 0;
  aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11aee8;
  fStack_1e38.multi_kv_instances = (bool)(char)pfVar25;
  fdb_open(&pfStack_2290,"./mvcc_test6",(fdb_config *)(acStack_1f38 + 0x100));
  uStack_2284 = (uint)pfVar25;
  if (uStack_2284 == 0) {
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11af54;
    fdb_kvs_open_default
              (pfStack_2290,(fdb_kvs_handle **)&aaStack_2268[0].seqtree,
               (fdb_kvs_config *)(acStack_2238 + 8));
    aVar17 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x1;
  }
  else {
    paVar11 = aaStack_2268;
    aVar8.seqtree = (btree *)(acStack_2238 + 8);
    uVar27 = 0;
    do {
      aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11af19;
      sprintf(acStack_2238,"kv%d",uVar27 & 0xffffffff);
      aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11af2c;
      fdb_kvs_open(pfStack_2290,(fdb_kvs_handle **)&paVar11->seqtree,acStack_2238,
                   (fdb_kvs_config *)aVar8.seqtree);
      uVar27 = uVar27 + 1;
      paVar11 = paVar11 + 1;
    } while (uVar27 != 4);
    aVar17 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x4;
    handle_00 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x4;
  }
  pcVar31 = (char *)0x0;
  pcVar10 = logCallbackFunc;
  pcVar20 = "rollback_all_test";
  do {
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11af7a;
    fVar2 = fdb_set_log_callback
                      ((fdb_kvs_handle *)aaStack_2268[(long)pcVar31].seqtree,logCallbackFunc,
                       "rollback_all_test");
    if (fVar2 != FDB_RESULT_SUCCESS) {
      aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b672;
      rollback_all_test();
      goto LAB_0011b672;
    }
    pcVar31 = (char *)((hbtrie_func_readkey *)pcVar31 + 1);
  } while (aVar17.seqtree != (btree *)pcVar31);
  uVar27 = 0;
  do {
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11afa9;
    sprintf(acStack_2038,"key%d",uVar27 & 0xffffffff);
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11afc5;
    sprintf(acStack_2138,"meta%d",uVar27 & 0xffffffff);
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11afe1;
    sprintf(acStack_1f38,"body%d",uVar27 & 0xffffffff);
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11aff4;
    sVar5 = strlen(acStack_2038);
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11afff;
    sVar6 = strlen(acStack_2138);
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b00a;
    sVar7 = strlen(acStack_1f38);
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b02f;
    fdb_doc_create((fdb_doc **)&aaStack_21d8[uVar27].seqtree,acStack_2038,sVar5,acStack_2138,sVar6,
                   acStack_1f38,sVar7);
    lVar16 = 0;
    do {
      aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b03f;
      fdb_set((fdb_kvs_handle *)aaStack_2268[lVar16].seqtree,(fdb_doc *)aaStack_21d8[uVar27].seqtree
             );
      lVar16 = lVar16 + 1;
    } while (aVar17.seqtree != (btree *)lVar16);
    uVar27 = uVar27 + 1;
  } while (uVar27 != 5);
  aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b063;
  fdb_commit(pfStack_2290,'\x01');
  uVar27 = 5;
  do {
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b085;
    sprintf(acStack_2038,"key%d",uVar27 & 0xffffffff);
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b0a1;
    sprintf(acStack_2138,"meta%d",uVar27 & 0xffffffff);
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b0bd;
    sprintf(acStack_1f38,"body%d",uVar27 & 0xffffffff);
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b0d0;
    sVar5 = strlen(acStack_2038);
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b0db;
    sVar6 = strlen(acStack_2138);
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b0e6;
    sVar7 = strlen(acStack_1f38);
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b10b;
    fdb_doc_create((fdb_doc **)&aaStack_21d8[uVar27].seqtree,acStack_2038,sVar5,acStack_2138,sVar6,
                   acStack_1f38,sVar7);
    lVar16 = 0;
    do {
      aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b11c;
      fdb_set((fdb_kvs_handle *)aaStack_2268[lVar16].seqtree,(fdb_doc *)aaStack_21d8[uVar27].seqtree
             );
      lVar16 = lVar16 + 1;
    } while (aVar17.seqtree != (btree *)lVar16);
    uVar27 = uVar27 + 1;
  } while (uVar27 != 10);
  aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b13d;
  fdb_commit(pfStack_2290,'\0');
  uVar27 = 10;
  do {
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b15f;
    sprintf(acStack_2038,"key%d",uVar27 & 0xffffffff);
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b17b;
    sprintf(acStack_2138,"meta%d",uVar27 & 0xffffffff);
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b197;
    sprintf(acStack_1f38,"body%d",uVar27 & 0xffffffff);
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b1aa;
    sVar5 = strlen(acStack_2038);
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b1b5;
    sVar6 = strlen(acStack_2138);
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b1c0;
    sVar7 = strlen(acStack_1f38);
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b1e5;
    fdb_doc_create((fdb_doc **)&aaStack_21d8[uVar27].seqtree,acStack_2038,sVar5,acStack_2138,sVar6,
                   acStack_1f38,sVar7);
    lVar16 = 0;
    do {
      aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b1f6;
      fdb_set((fdb_kvs_handle *)aaStack_2268[lVar16].seqtree,(fdb_doc *)aaStack_21d8[uVar27].seqtree
             );
      lVar16 = lVar16 + 1;
    } while (aVar17.seqtree != (btree *)lVar16);
    uVar27 = uVar27 + 1;
  } while (uVar27 != 0xf);
  aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b21a;
  fdb_commit(pfStack_2290,'\x01');
  uVar27 = 0xf;
  do {
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b23c;
    sprintf(acStack_2038,"key%d",uVar27 & 0xffffffff);
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b258;
    sprintf(acStack_2138,"meta%d",uVar27 & 0xffffffff);
    aVar22.seqtree = (btree *)acStack_1f38;
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b274;
    sprintf((char *)aVar22.seqtree,"body%d",uVar27 & 0xffffffff);
    aVar8.seqtree = (btree *)(aaStack_21d8 + uVar27);
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b287;
    sVar5 = strlen(acStack_2038);
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b292;
    handle_00 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)strlen(acStack_2138);
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b29d;
    sVar6 = strlen((char *)aVar22.seqtree);
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b2c2;
    fdb_doc_create((fdb_doc **)aVar8.seqtree,acStack_2038,sVar5,acStack_2138,(size_t)handle_00,
                   aVar22.seqtree,sVar6);
    pcVar31 = (char *)0x0;
    do {
      aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b2d3;
      fdb_set((fdb_kvs_handle *)aaStack_2268[(long)pcVar31].seqtree,
              (fdb_doc *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)&(aVar8.seqtree)->ksize)->seqtree);
      pcVar31 = (char *)((long)pcVar31 + 1);
    } while (aVar17.seqtree != (btree *)pcVar31);
    uVar27 = uVar27 + 1;
  } while (uVar27 != 0x14);
  aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b2f4;
  fdb_commit(pfStack_2290,'\0');
  aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b308;
  fVar2 = fdb_get_all_snap_markers
                    (pfStack_2290,(fdb_snapshot_info_t **)&pfStack_2278,(uint64_t *)&pfStack_2280);
  pcVar20 = (char *)0x14;
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcVar31 = (char *)(ulong)uStack_2284;
    cVar28 = (char)uStack_2284;
    if (cVar28 == '\0') {
      if (pfStack_2280 != (fdb_kvs_handle *)0x4) {
        aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b341;
        rollback_all_test();
      }
    }
    else if (pfStack_2280 != (fdb_kvs_handle *)0x8) {
      aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b32f;
      rollback_all_test();
    }
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b354;
    fVar2 = fdb_rollback_all(pfStack_2290,(fdb_snapshot_marker_t)pfStack_2278->kvs);
    if (cVar28 == '\0') {
LAB_0011b41a:
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b69d;
      handle_00.seqtree = (btree *)&aStack_2270;
      if (cVar28 != '\0') {
        pcVar20 = acStack_2238;
        pcVar31 = "rollback_all_test";
        aVar22.seqtree = (btree *)0x0;
        aVar8 = aVar17;
        do {
          handle_00.seqtree = handle_00.seqtree + 8;
          aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b450;
          sprintf(pcVar20,"kv%d",aVar22.seqtree);
          aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b465;
          fVar2 = fdb_kvs_open(pfStack_2290,(fdb_kvs_handle **)handle_00.seqtree,pcVar20,
                               (fdb_kvs_config *)(acStack_2238 + 8));
          if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b693;
          aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b480;
          fVar2 = fdb_set_log_callback
                            (*(fdb_kvs_handle **)handle_00.seqtree,logCallbackFunc,
                             "rollback_all_test");
          if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b68e;
          aVar22._0_4_ = aVar22._0_4_ + 1;
          aVar22._4_4_ = 0;
          aVar8.seqtree = (btree *)((long)(aVar8.seqtree + -1) + 0x37);
        } while (aVar8.seqtree != (btree *)0x0);
      }
      aVar8.seqtree = (btree *)0x0;
      handle_00.seqtree = (btree *)&aStack_2270;
      pcVar20 = (char *)&aStack_2240;
      do {
        aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b4b2;
        fVar2 = fdb_get_kvs_info((fdb_kvs_handle *)aaStack_2268[(long)aVar8].seqtree,&fStack_2218);
        pcVar10 = (code *)aVar22;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b677;
        if (fStack_2218.last_seqnum != 0xf) {
          aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b566;
          rollback_all_test();
        }
        if (fStack_2218.doc_count != 0xf) {
          aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b578;
          rollback_all_test();
        }
        aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b4ea;
        fVar2 = fdb_get((fdb_kvs_handle *)aaStack_2268[(long)aVar8].seqtree,pfStack_2140);
        if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0011b672;
        aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b512;
        fVar2 = fdb_get_kv((fdb_kvs_handle *)aaStack_2268[(long)aVar8].seqtree,
                           (aaStack_21d8[0].seqtrie)->aux,
                           *(size_t *)&(aaStack_21d8[0].seqtree)->ksize,(void **)handle_00.seqtree,
                           (size_t *)pcVar20);
        pcVar10 = (code *)aStack_2270;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b684;
        pcVar31 = (char *)(aaStack_21d8[0].seqtrie)->readkey;
        aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b53b;
        iVar4 = bcmp(pcVar31,aStack_2270.seqtree,(size_t)aStack_2240);
        if (iVar4 != 0) goto LAB_0011b67c;
        aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b54b;
        free(pcVar10);
        uVar14 = uStack_2284;
        aVar8.seqtree = (btree *)&(aVar8.seqtree)->vsize;
        aVar22 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar10;
      } while ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)aVar17.seqtree != aVar8.seqtree);
      aVar22.seqtree = (btree *)0x0;
      pcVar31 = (char *)(ulong)uStack_2284;
      do {
        aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b596;
        fVar2 = fdb_set((fdb_kvs_handle *)aaStack_2268[(long)aVar22].seqtree,
                        (fdb_doc *)aaStack_21d8[0].seqtree);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b689;
        aVar22.seqtree = (btree *)&(aVar22.seqtree)->vsize;
      } while ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)aVar17.seqtree != aVar22.seqtree);
      aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b5b5;
      fVar2 = fdb_commit(pfStack_2290,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b6a2;
      aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b5c7;
      fdb_close(pfStack_2290);
      lVar16 = 0;
      do {
        aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b5d6;
        fdb_doc_free((fdb_doc *)aaStack_21d8[lVar16].seqtree);
        lVar16 = lVar16 + 1;
      } while (lVar16 != 0x14);
      aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b5ee;
      fVar2 = fdb_free_snap_markers((fdb_snapshot_info_t *)pfStack_2278,(uint64_t)pfStack_2280);
      aVar22 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x14;
      if (fVar2 == FDB_RESULT_SUCCESS) {
        aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b5fb;
        fdb_shutdown();
        aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b600;
        memleak_end();
        pcVar20 = "single kv mode:";
        if ((char)uVar14 != '\0') {
          pcVar20 = "multiple kv mode:";
        }
        aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b62e;
        sprintf(acStack_1f38,"rollback all test %s",pcVar20);
        pcVar20 = "%s PASSED\n";
        if (rollback_all_test(bool)::__test_pass != '\0') {
          pcVar20 = "%s FAILED\n";
        }
        aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b65b;
        fprintf(_stderr,pcVar20,acStack_1f38);
        return;
      }
      goto LAB_0011b6a7;
    }
    if (fVar2 != FDB_RESULT_KV_STORE_BUSY) goto LAB_0011b6ac;
    aVar22 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x0;
    do {
      aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b372;
      fdb_kvs_close((fdb_kvs_handle *)aaStack_2268[(long)aVar22].seqtree);
      aVar22.seqtree = aVar22.seqtree + 1;
    } while ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)aVar17.seqtree != aVar22.seqtree);
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b396;
    fVar2 = fdb_open((fdb_file_handle **)&fStack_2218,"./mvcc_test6",
                     (fdb_config *)(acStack_1f38 + 0x100));
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b6b1;
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b3bc;
    fVar2 = fdb_kvs_open((fdb_file_handle *)fStack_2218.name,(fdb_kvs_handle **)&aStack_2270.seqtree
                         ,"kv0",(fdb_kvs_config *)(acStack_2238 + 8));
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b6b6;
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b3d7;
    fVar2 = fdb_rollback_all(pfStack_2290,(fdb_snapshot_marker_t)pfStack_2278->kvs);
    if (fVar2 != FDB_RESULT_KV_STORE_BUSY) goto LAB_0011b6bb;
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b3ea;
    fVar2 = fdb_kvs_close((fdb_kvs_handle *)aStack_2270.seqtree);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b6c0;
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b3ff;
    fVar2 = fdb_close((fdb_file_handle *)fStack_2218.name);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b41a;
      fVar2 = fdb_rollback_all(pfStack_2290,(fdb_snapshot_marker_t)pfStack_2278->kvs);
      goto LAB_0011b41a;
    }
  }
  else {
LAB_0011b698:
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b69d;
    rollback_all_test();
LAB_0011b69d:
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6a2;
    rollback_all_test();
LAB_0011b6a2:
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6a7;
    rollback_all_test();
LAB_0011b6a7:
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6ac;
    rollback_all_test();
LAB_0011b6ac:
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6b1;
    rollback_all_test();
LAB_0011b6b1:
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6b6;
    rollback_all_test();
LAB_0011b6b6:
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6bb;
    rollback_all_test();
LAB_0011b6bb:
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6c0;
    rollback_all_test();
LAB_0011b6c0:
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6c5;
    rollback_all_test();
  }
  aStack_22a0.seqtree = (btree *)auto_compaction_snapshots_test;
  rollback_all_test();
  aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6e7;
  aStack_22c8 = aVar22;
  aStack_22c0 = aVar8;
  aStack_22b8 = handle_00;
  phStack_22b0 = (hbtrie_func_readkey *)pcVar31;
  aStack_22a8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar20;
  aStack_22a0 = aVar17;
  gettimeofday(&tStack_2420,(__timezone_ptr_t)0x0);
  aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6ec;
  memleak_start();
  puVar32 = &uStack_2464;
  uStack_2464 = 0;
  aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b704;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fconfig_00.seqtree = (btree *)auStack_23c0;
  aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b714;
  fdb_get_default_config();
  uStack_2392 = 1;
  uStack_23a0 = 1;
  pcStack_2368 = compaction_cb_count;
  uStack_2360 = 0x20;
  uStack_2388 = 1;
  aVar22.seqtree = (btree *)0x156054;
  aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b74e;
  puStack_2358 = puVar32;
  fVar2 = fdb_open(&pfStack_2470,"mvcc_test1",(fdb_config *)fconfig_00.seqtree);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fconfig_00.seqtree = (btree *)afStack_2460;
    aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b763;
    fdb_get_default_kvs_config();
    fStack_2410.custom_cmp_param = afStack_2460[0].custom_cmp_param;
    fStack_2410.create_if_missing = afStack_2460[0].create_if_missing;
    fStack_2410._1_7_ = afStack_2460[0]._1_7_;
    fStack_2410.custom_cmp = afStack_2460[0].custom_cmp;
    aVar22.seqtree = (btree *)&aStack_2478;
    aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b788;
    fVar2 = fdb_kvs_open_default(pfStack_2470,(fdb_kvs_handle **)aVar22.seqtree,&fStack_2410);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba6f;
    handle_00.seqtree = (btree *)0x156958;
    aVar8.seqtree = (btree *)0x0;
    do {
      pcVar20 = (char *)0xcccccccd;
      aVar18.seqtree = (btree *)0x1565bd;
      aVar22.seqtree = (btree *)afStack_2460;
      iVar4 = aVar8._0_4_;
      aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b7bc;
      sprintf((char *)aVar22.seqtree,"%d",aVar8.seqtree);
      aVar17 = aStack_2478;
      aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b7c9;
      sVar5 = strlen((char *)aVar22.seqtree);
      aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b7e0;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)aVar17.seqtree,aVar22.seqtree,sVar5,"value",5);
      aVar19.seqtree = handle_00.seqtree;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba28;
        auto_compaction_snapshots_test();
LAB_0011ba28:
        aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba2d;
        auto_compaction_snapshots_test();
LAB_0011ba2d:
        fconfig_00 = aVar17;
        aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba32;
        auto_compaction_snapshots_test();
LAB_0011ba32:
        aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba37;
        auto_compaction_snapshots_test();
LAB_0011ba37:
        aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba3c;
        auto_compaction_snapshots_test();
        handle_00 = aVar19;
        doc_01 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar20;
LAB_0011ba3c:
        aVar19 = handle_00;
        handle_00 = aVar18;
        aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba41;
        auto_compaction_snapshots_test();
LAB_0011ba41:
        aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba4e;
        auto_compaction_snapshots_test();
LAB_0011ba4e:
        aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba5b;
        aVar22 = fconfig_00;
        auto_compaction_snapshots_test();
LAB_0011ba5b:
        aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba60;
        auto_compaction_snapshots_test();
        aVar17 = handle_00;
        pcVar20 = (char *)doc_01;
LAB_0011ba60:
        handle_00 = aVar19;
        aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba65;
        auto_compaction_snapshots_test();
LAB_0011ba65:
        puVar32 = (uint *)afStack_2460;
        aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba6a;
        auto_compaction_snapshots_test();
        goto LAB_0011ba6a;
      }
      aVar17 = aVar8;
      if ((int)((ulong)aVar8.seqtree / 10) * 10 == iVar4) {
        aVar22.seqtree = (btree *)0x0;
        aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b80c;
        fVar2 = fdb_commit(pfStack_2470,'\0');
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba28;
      }
      fconfig_00 = aVar8;
      if ((int)((ulong)aVar8.seqtree / 100) * 100 == iVar4) {
        aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b83d;
        fVar2 = fdb_get_kvs_info((fdb_kvs_handle *)aStack_2478.seqtree,&fStack_23f0);
        fconfig_00 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)fStack_23f0.last_seqnum;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba2d;
        aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b85f;
        fVar2 = fdb_snapshot_open((fdb_kvs_handle *)aStack_2478.seqtree,&pfStack_2480,
                                  fStack_23f0.last_seqnum);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba37;
        aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b885;
        fdb_doc_create((fdb_doc **)&aStack_2488.seqtree,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
        (aStack_2488.seqtrie)->btree_blk_ops = (btree_blk_ops *)fconfig_00;
        aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b898;
        fVar2 = fdb_get_byseq(pfStack_2480,(fdb_doc *)aStack_2488.seqtree);
        aVar19 = aStack_2488;
        doc_01.seqtree = (btree *)pcVar20;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba3c;
        pcVar20 = (char *)(aStack_2488.seqtrie)->aux;
        aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b8b9;
        sVar5 = strlen(&afStack_2460[0].create_if_missing);
        aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b8c7;
        iVar3 = bcmp(pcVar20,afStack_2460,sVar5);
        doc_01 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar20;
        if (iVar3 != 0) goto LAB_0011ba41;
        aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b8d7;
        fdb_doc_free((fdb_doc *)aVar19.seqtree);
        aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b8e1;
        fVar2 = fdb_kvs_close(pfStack_2480);
        aVar18.seqtree = handle_00.seqtree;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba32;
        aVar22.seqtree = (btree *)&pfStack_2480;
        aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b8ff;
        fVar2 = fdb_snapshot_open((fdb_kvs_handle *)aStack_2478.seqtree,
                                  (fdb_kvs_handle **)aVar22.seqtree,0xffffffffffffffff);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba5b;
        aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b925;
        fdb_doc_create((fdb_doc **)&aStack_2488.seqtree,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
        (aStack_2488.seqtrie)->btree_blk_ops = (btree_blk_ops *)fconfig_00;
        aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b938;
        aVar22 = aStack_2488;
        fVar2 = fdb_get_byseq(pfStack_2480,(fdb_doc *)aStack_2488.seqtree);
        doc_01 = aStack_2488;
        aVar17.seqtree = handle_00.seqtree;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba60;
        fconfig_00 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)(aStack_2488.seqtrie)->aux;
        aVar22.seqtree = (btree *)afStack_2460;
        aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b956;
        sVar5 = strlen((char *)aVar22.seqtree);
        aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b964;
        iVar3 = bcmp(fconfig_00.seqtree,aVar22.seqtree,sVar5);
        if (iVar3 != 0) goto LAB_0011ba4e;
        aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b974;
        fdb_doc_free((fdb_doc *)doc_01.seqtree);
        aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b97e;
        fVar2 = fdb_kvs_close(pfStack_2480);
        pcVar20 = (char *)0xcccccccd;
        aVar17.seqtree = (btree *)0x1565bd;
        if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011b996;
        goto LAB_0011ba65;
      }
LAB_0011b996:
      puVar32 = (uint *)afStack_2460;
      pcVar20 = (char *)0xcccccccd;
      aVar17.seqtree = (btree *)0x1565bd;
      aVar8._0_4_ = iVar4 + 1;
      aVar8._4_4_ = 0;
    } while (aVar8._0_4_ != 100000);
    aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b9b0;
    fVar2 = fdb_close(pfStack_2470);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba74;
    aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b9bd;
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b9ca;
      memleak_end();
      aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b9e4;
      sprintf(&afStack_2460[0].create_if_missing,"auto compaction completed %d times with snapshots"
              ,(ulong)uStack_2464);
      pcVar20 = "%s PASSED\n";
      if (auto_compaction_snapshots_test()::__test_pass != '\0') {
        pcVar20 = "%s FAILED\n";
      }
      aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba11;
      fprintf(_stderr,pcVar20,afStack_2460);
      return;
    }
  }
  else {
LAB_0011ba6a:
    aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba6f;
    auto_compaction_snapshots_test();
LAB_0011ba6f:
    aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba74;
    auto_compaction_snapshots_test();
LAB_0011ba74:
    aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba79;
    auto_compaction_snapshots_test();
  }
  aStack_2498.seqtree = (btree *)compaction_cb_count;
  auto_compaction_snapshots_test();
  aVar19.seqtree = aVar22.seqtree & 0xffffffff;
  __tv = &tStack_24b0;
  aStack_24c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba95;
  aStack_24a0 = fconfig_00;
  aStack_2498 = aVar17;
  gettimeofday(__tv,(__timezone_ptr_t)0x0);
  if (aVar22._0_4_ == 0x20) {
    if (extraout_RDX_00 == 0) {
      *(int *)&(aStack_2488.seqtree)->ksize = *(int *)&(aStack_2488.seqtree)->ksize + 1;
      return;
    }
  }
  else {
    aStack_24c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bab4;
    compaction_cb_count();
  }
  aStack_24c0.seqtree = (btree *)rollback_during_ops_test;
  compaction_cb_count();
  aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bad9;
  aStack_24e0 = aVar8;
  aStack_24d8 = handle_00;
  puStack_24d0 = puVar32;
  aStack_24c8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar20;
  aStack_24c0.seqtree = aVar19.seqtree;
  gettimeofday((timeval *)(acStack_2717 + 0x2f),(__timezone_ptr_t)0x0);
  aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bade;
  memleak_start();
  iStack_2734 = 10000;
  if (__tv == (timeval *)0x0) {
    aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bafb;
    system("rm -rf  mvcc_test* > errorlog.txt");
    aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb08;
    fdb_get_default_config();
    fconfig_02 = &fStack_25e0;
    aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb20;
    memcpy(fconfig_02,auStack_26d8,0xf8);
    fStack_25e0.block_reusing_threshold = 0;
    aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb3f;
    fVar2 = fdb_open(&pfStack_2728,"mvcc_test1",fconfig_02);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb54;
      fdb_get_default_kvs_config();
      uStack_26f0 = uStack_26c8;
      pcStack_2700 = (char *)auStack_26d8._0_8_;
      pfStack_26f8 = (fdb_config *)auStack_26d8._8_8_;
      aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb76;
      fVar2 = fdb_kvs_open_default
                        (pfStack_2728,(fdb_kvs_handle **)&aStack_2730.seqtree,
                         (fdb_kvs_config *)(acStack_2717 + 0x17));
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bf9d;
      if (0 < iStack_2734) {
        handle_00 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x1;
        __tv = (timeval *)CONCAT71((int7)((ulong)auStack_26d8 >> 8),1);
        uVar14 = 0;
        do {
          aVar19._0_4_ = uVar14 + 1;
          aVar19._4_4_ = 0;
          aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bbb0;
          sprintf(acStack_2717,"%d",aVar19.seqtree);
          aVar8 = aStack_2730;
          aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bbbd;
          sVar5 = strlen(acStack_2717);
          aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bbd8;
          fVar2 = fdb_set_kv((fdb_kvs_handle *)aVar8.seqtree,acStack_2717,sVar5,"value",5);
          if (fVar2 != FDB_RESULT_SUCCESS) {
            aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be65;
            rollback_during_ops_test();
            goto LAB_0011be65;
          }
          ptVar12 = __tv;
          if ((int)((ulong)handle_00.seqtree / 10) * 10 - 1U == uVar14) {
            ptVar12 = (timeval *)((ulong)__tv & 0xffffffff ^ 1);
            aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bc18;
            fdb_commit(pfStack_2728,~(byte)__tv & 1);
          }
          handle_00._0_4_ = handle_00._0_4_ + 1;
          handle_00._4_4_ = 0;
          __tv = ptVar12;
          uVar14 = aVar19._0_4_;
        } while ((int)aVar19._0_4_ < iStack_2734);
      }
      aVar19 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x1;
      aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bc3f;
      fdb_commit(pfStack_2728,'\x01');
      aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bc4e;
      fdb_get_kvs_info((fdb_kvs_handle *)aStack_2730.seqtree,(fdb_kvs_info *)auStack_26d8);
      __tv = (timeval *)(auStack_26d8 + 8);
      if ((fdb_config *)auStack_26d8._8_8_ != (fdb_config *)(long)iStack_2734) {
        aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bc6a;
        rollback_during_ops_test();
      }
      aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bc82;
      pthread_create(&pStack_2720,(pthread_attr_t *)0x0,rollback_during_ops_test,&iStack_2734);
      fconfig_02 = (fdb_config *)0x156958;
      pcVar20 = acStack_2717;
      aVar8.seqtree = (btree *)0x1565bd;
      do {
        aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bca4;
        sprintf(pcVar20,"%d",aVar19.seqtree);
        handle_00 = aStack_2730;
        aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bcb1;
        sVar5 = strlen(pcVar20);
        aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bcc8;
        fVar2 = fdb_set_kv((fdb_kvs_handle *)handle_00.seqtree,pcVar20,sVar5,"value",5);
        if (fVar2 != FDB_RESULT_FAIL_BY_ROLLBACK) {
          if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011be65;
          aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bce4;
          fVar2 = fdb_commit(pfStack_2728,'\x01');
          if ((fVar2 != FDB_RESULT_FAIL_BY_ROLLBACK) && (fVar2 != FDB_RESULT_SUCCESS))
          goto LAB_0011be6a;
        }
        aVar19._0_4_ = aVar19._0_4_ + 1;
        aVar19._4_4_ = 0;
      } while (aVar19._0_4_ != 0x2711);
      aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bd0a;
      pthread_join(pStack_2720,(void **)(acStack_2717 + 0xf));
      aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bd2d;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)aStack_2730.seqtree,"key1",4,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfa2;
      aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bd44;
      fVar2 = fdb_commit(pfStack_2728,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfa7;
      aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bd5e;
      fdb_get_kvs_info((fdb_kvs_handle *)aStack_2730.seqtree,(fdb_kvs_info *)auStack_26d8);
      fconfig_02 = (fdb_config *)auStack_26d8._8_8_;
      aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bd85;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)aStack_2730.seqtree,"key2",4,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfac;
      aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bdb0;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)aStack_2730.seqtree,"key3",4,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfb1;
      aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bdc7;
      fVar2 = fdb_commit(pfStack_2728,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfb6;
      aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bddc;
      fVar2 = fdb_rollback((fdb_kvs_handle **)&aStack_2730.seqtree,(fdb_seqnum_t)fconfig_02);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bdf6;
        fdb_get_kvs_info((fdb_kvs_handle *)aStack_2730.seqtree,(fdb_kvs_info *)auStack_26d8);
        if ((fdb_config *)auStack_26d8._8_8_ != fconfig_02) {
          aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be07;
          rollback_during_ops_test();
        }
        aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be11;
        fdb_close(pfStack_2728);
        aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be16;
        fdb_shutdown();
        aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be1b;
        memleak_end();
        pcVar20 = "%s PASSED\n";
        if (rollback_during_ops_test(void*)::__test_pass != '\0') {
          pcVar20 = "%s FAILED\n";
        }
        aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be4c;
        fprintf(_stderr,pcVar20,"rollback during ops test");
        return;
      }
    }
    else {
      aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf9d;
      rollback_during_ops_test();
LAB_0011bf9d:
      __tv = (timeval *)auStack_26d8;
      aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfa2;
      rollback_during_ops_test();
LAB_0011bfa2:
      aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfa7;
      rollback_during_ops_test();
LAB_0011bfa7:
      aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfac;
      rollback_during_ops_test();
LAB_0011bfac:
      aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfb1;
      rollback_during_ops_test();
LAB_0011bfb1:
      aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfb6;
      rollback_during_ops_test();
LAB_0011bfb6:
      aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfbb;
      rollback_during_ops_test();
    }
    aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfc0;
    rollback_during_ops_test();
LAB_0011bfc0:
    aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfc5;
    rollback_during_ops_test();
  }
  else {
LAB_0011be6f:
    fconfig_02 = (fdb_config *)auStack_26d8;
    aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be7c;
    fdb_get_default_config();
    pcVar20 = (char *)&fStack_25e0;
    aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be94;
    memcpy(pcVar20,fconfig_02,0xf8);
    fStack_25e0.block_reusing_threshold = 0;
    aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11beb3;
    fVar2 = fdb_open(&pfStack_2728,"mvcc_test1",(fdb_config *)pcVar20);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfc0;
    fconfig_02 = (fdb_config *)auStack_26d8;
    aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bec8;
    fdb_get_default_kvs_config();
    uStack_26f0 = uStack_26c8;
    pcStack_2700 = (char *)auStack_26d8._0_8_;
    pfStack_26f8 = (fdb_config *)auStack_26d8._8_8_;
    aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11beeb;
    fVar2 = fdb_kvs_open_default
                      (pfStack_2728,(fdb_kvs_handle **)&aStack_2730.seqtree,
                       (fdb_kvs_config *)(acStack_2717 + 0x17));
    if (fVar2 == FDB_RESULT_SUCCESS) {
      iStack_2734 = (int)__tv->tv_sec;
      if (1 < (long)iStack_2734) {
        handle_00.seqtree = (btree *)0xcccccccd;
        fconfig_02 = (fdb_config *)0x156958;
        pcVar20 = acStack_2717;
        aVar8.seqtree = (btree *)0x1565bd;
        __tv = (timeval *)(long)iStack_2734;
        do {
          aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf2c;
          sprintf(pcVar20,"%d",(ulong)__tv & 0xffffffff);
          aVar19 = aStack_2730;
          aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf39;
          sVar5 = strlen(pcVar20);
          aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf50;
          fVar2 = fdb_set_kv((fdb_kvs_handle *)aVar19.seqtree,pcVar20,sVar5,"value",5);
          if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfca;
          if ((int)(((ulong)__tv & 0xffffffff) / 10) * -10 + (int)__tv == 0) {
            aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf76;
            fVar2 = fdb_rollback((fdb_kvs_handle **)&aStack_2730.seqtree,(fdb_seqnum_t)__tv);
            if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfcf;
          }
          bVar1 = 2 < (long)__tv;
          __tv = (timeval *)((long)&__tv[-1].tv_usec + 7);
        } while (bVar1);
      }
      aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf91;
      fdb_close(pfStack_2728);
      aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf98;
      pthread_exit((void *)0x0);
    }
  }
  aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfca;
  rollback_during_ops_test();
LAB_0011bfca:
  aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfcf;
  rollback_during_ops_test();
LAB_0011bfcf:
  aStack_2748.seqtree = (btree *)in_memory_snapshot_rollback_test;
  rollback_during_ops_test();
  aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bff0;
  ptStack_2768 = __tv;
  aStack_2760 = aVar8;
  aStack_2758 = handle_00;
  pfStack_2750 = fconfig_02;
  aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar20;
  gettimeofday((timeval *)(auStack_28c7 + 0xf),(__timezone_ptr_t)0x0);
  aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bff5;
  memleak_start();
  aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c001;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fconfig_01 = &fStack_2860;
  aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c011;
  fdb_get_default_config();
  aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c025;
  fVar2 = fdb_open(&pfStack_28e8,"mvcc_test1",fconfig_01);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fconfig_01 = (fdb_config *)(auStack_28a8 + 0x30);
    aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c03d;
    fdb_get_default_kvs_config();
    aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c04f;
    fVar2 = fdb_kvs_open_default
                      (pfStack_28e8,(fdb_kvs_handle **)&aStack_28f0.seqtree,
                       (fdb_kvs_config *)fconfig_01);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c270;
    fconfig_01 = (fdb_config *)0x1;
    fconfig_02 = (fdb_config *)0x156958;
    pcVar20 = auStack_28c7;
    aVar8.seqtree = (btree *)0x1565bd;
    do {
      aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c07e;
      sprintf(pcVar20,"%d",fconfig_01);
      handle_00 = aStack_28f0;
      aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c08b;
      sVar5 = strlen(pcVar20);
      aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c0a2;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)handle_00.seqtree,pcVar20,sVar5,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c266;
        in_memory_snapshot_rollback_test();
        goto LAB_0011c266;
      }
      uVar14 = (int)fconfig_01 + 1;
      fconfig_01 = (fdb_config *)(ulong)uVar14;
    } while (uVar14 != 4);
    aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c0bd;
    fdb_commit(pfStack_28e8,'\0');
    aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c0e0;
    fVar2 = fdb_set_kv((fdb_kvs_handle *)aStack_28f0.seqtree,"key4",4,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c275;
    aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c10b;
    fVar2 = fdb_set_kv((fdb_kvs_handle *)aStack_28f0.seqtree,"key5",4,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c27a;
    aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c122;
    fVar2 = fdb_commit(pfStack_28e8,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c27f;
    aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c139;
    fVar2 = fdb_rollback((fdb_kvs_handle **)&aStack_28f0.seqtree,3);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c284;
    fconfig_01 = (fdb_config *)auStack_28a8;
    aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c153;
    fdb_get_kvs_info((fdb_kvs_handle *)aStack_28f0.seqtree,(fdb_kvs_info *)fconfig_01);
    if (auStack_28a8._8_8_ != 3) {
      aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c164;
      in_memory_snapshot_rollback_test();
    }
    aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c17a;
    fVar2 = fdb_snapshot_open((fdb_kvs_handle *)aStack_28f0.seqtree,&pfStack_28d0,0xffffffffffffffff
                             );
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c289;
    aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c1a2;
    fdb_iterator_init(pfStack_28d0,&pfStack_28e0,(void *)0x0,0,(void *)0x0,0,0);
    fconfig_01 = (fdb_config *)&pfStack_28d8;
    pfStack_28d8 = (fdb_doc *)0x0;
    fconfig_02 = (fdb_config *)0x3;
    do {
      aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c1c1;
      fVar2 = fdb_iterator_get(pfStack_28e0,(fdb_doc **)fconfig_01);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c266;
      aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c1d3;
      fdb_doc_free(pfStack_28d8);
      pfStack_28d8 = (fdb_doc *)0x0;
      aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c1e6;
      fVar2 = fdb_iterator_next(pfStack_28e0);
      fconfig_02 = (fdb_config *)&fconfig_02[-1].field_0xf7;
    } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
    if (fconfig_02 == (fdb_config *)0x0) {
      aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c201;
      fdb_iterator_close(pfStack_28e0);
      aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c20b;
      fdb_kvs_close(pfStack_28d0);
      aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c215;
      fdb_close(pfStack_28e8);
      aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c21a;
      fdb_shutdown();
      aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c21f;
      memleak_end();
      pcVar20 = "%s PASSED\n";
      if (in_memory_snapshot_rollback_test()::__test_pass != '\0') {
        pcVar20 = "%s FAILED\n";
      }
      aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c250;
      fprintf(_stderr,pcVar20,"in-memory snapshot rollback test");
      return;
    }
  }
  else {
LAB_0011c26b:
    aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c270;
    in_memory_snapshot_rollback_test();
LAB_0011c270:
    aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c275;
    in_memory_snapshot_rollback_test();
LAB_0011c275:
    aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c27a;
    in_memory_snapshot_rollback_test();
LAB_0011c27a:
    aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c27f;
    in_memory_snapshot_rollback_test();
LAB_0011c27f:
    aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c284;
    in_memory_snapshot_rollback_test();
LAB_0011c284:
    aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c289;
    in_memory_snapshot_rollback_test();
LAB_0011c289:
    aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c28e;
    in_memory_snapshot_rollback_test();
  }
  aStack_2900.seqtree = (btree *)rollback_drop_multi_files_kvs_test;
  in_memory_snapshot_rollback_test();
  pcStack_4db8 = (code *)0x11c2b0;
  pfStack_2928 = fconfig_01;
  aStack_2920 = aVar8;
  aStack_2918 = handle_00;
  pfStack_2910 = fconfig_02;
  aStack_2908 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar20;
  aStack_2900 = aVar19;
  gettimeofday(&tStack_4d40,(__timezone_ptr_t)0x0);
  pcStack_4db8 = (code *)0x11c2b5;
  memleak_start();
  pcStack_4db8 = (code *)0x11c2c1;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_4db8 = (code *)0x11c2d1;
  fdb_get_default_config();
  pcStack_4db8 = (code *)0x11c2db;
  fdb_get_default_kvs_config();
  fStack_4c28.wal_threshold = 0x400;
  fStack_4c28.compaction_mode = 0;
  fStack_4c28.durability_opt = 2;
  pfVar9 = (fdb_kvs_handle *)(apfStack_4a30 + 0x20);
  ppfVar13 = apfStack_4d30;
  pcVar20 = "kvs%d";
  uVar27 = 0;
  ppfVar33 = (fdb_kvs_handle **)0x0;
  do {
    pcStack_4db8 = (code *)0x11c31b;
    sprintf((char *)ppfVar13,"mvcc_test%d",(ulong)ppfVar33 & 0xffffffff);
    pcVar31 = (char *)(apfStack_4da0 + (long)ppfVar33);
    pcStack_4db8 = (code *)0x11c336;
    ppfVar26 = (fdb_kvs_handle **)pcVar31;
    fVar2 = fdb_open((fdb_file_handle **)pcVar31,(char *)ppfVar13,
                     (fdb_config *)(apfStack_4d30 + 0x21));
    iVar4 = (int)ppfVar26;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c685;
    ppfVar26 = (fdb_kvs_handle **)0x0;
    ppfStack_4db0 = ppfVar33;
    pfStack_4da8 = pfVar9;
    do {
      ppfVar33 = ppfVar26;
      pcStack_4db8 = (code *)0x11c35b;
      sprintf((char *)ppfVar13,"kvs%d",(ulong)(uint)((int)ppfVar33 + (int)uVar27));
      pfVar37 = *(fdb_kvs_handle **)pcVar31;
      pcStack_4db8 = (code *)0x11c36e;
      fVar2 = fdb_kvs_open((fdb_file_handle *)pfVar37,(fdb_kvs_handle **)pfVar9,(char *)ppfVar13,
                           (fdb_kvs_config *)(apfStack_4da0 + 9));
      iVar4 = (int)pfVar37;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pcStack_4db8 = (code *)0x11c67b;
        rollback_drop_multi_files_kvs_test();
        goto LAB_0011c67b;
      }
      pfVar9 = (fdb_kvs_handle *)&(pfVar9->kvs_config).custom_cmp;
      ppfVar26 = (fdb_kvs_handle **)((long)ppfVar33 + 1);
    } while ((char *)((long)ppfVar33 + 1) != (char *)0x80);
    ppfVar33 = (fdb_kvs_handle **)((long)ppfStack_4db0 + 1);
    uVar27 = uVar27 + 0x80;
    pfVar9 = (fdb_kvs_handle *)&pfStack_4da8[1].bub_ctx.space_used;
  } while (ppfVar33 != (fdb_kvs_handle **)0x8);
  ppfVar33 = apfStack_4d30 + 0x40;
  ppfVar13 = apfStack_4a30;
  pfVar9 = (fdb_kvs_handle *)0x0;
  do {
    uVar27 = 0;
    do {
      pcStack_4db8 = (code *)0x11c3cf;
      sprintf((char *)ppfVar33,"key%08d",uVar27);
      pcStack_4db8 = (code *)0x11c3e2;
      sprintf((char *)ppfVar13,"value%08d",uVar27);
      pcVar20 = (char *)apfStack_4a30[(long)&pfVar9->op_stats];
      pcStack_4db8 = (code *)0x11c3f2;
      sVar5 = strlen((char *)ppfVar33);
      pcVar31 = (char *)(sVar5 + 1);
      pcStack_4db8 = (code *)0x11c3fe;
      sVar5 = strlen((char *)ppfVar13);
      pcStack_4db8 = (code *)0x11c413;
      pfVar37 = (fdb_kvs_handle *)pcVar20;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)pcVar20,ppfVar33,(size_t)pcVar31,ppfVar13,sVar5 + 1);
      iVar4 = (int)pfVar37;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c67b;
      uVar14 = (int)uVar27 + 1;
      uVar27 = (ulong)uVar14;
    } while (uVar14 != 10);
    pfVar9 = (fdb_kvs_handle *)&(pfVar9->kvs_config).field_0x1;
  } while (pfVar9 != (fdb_kvs_handle *)0x400);
  pcVar31 = (char *)0x0;
  do {
    pfVar37 = apfStack_4da0[(long)pcVar31];
    if (((ulong)pcVar31 & 1) == 0) {
      pcStack_4db8 = (code *)0x11c441;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar37,'\0');
      iVar4 = (int)pfVar37;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c6a3;
    }
    else {
      pcStack_4db8 = (code *)0x11c454;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar37,'\x01');
      iVar4 = (int)pfVar37;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c6a8;
    }
    pcVar31 = (char *)((long)pcVar31 + 1);
  } while (pcVar31 != (char *)0x8);
  pcVar31 = "key%08d";
  ppfVar33 = apfStack_4d30 + 0x40;
  ppfVar13 = (fdb_kvs_handle **)0x0;
  do {
    uVar27 = 0;
    do {
      pcStack_4db8 = (code *)0x11c488;
      sprintf((char *)ppfVar33,"key%08d",uVar27);
      pfVar9 = apfStack_4a30[(long)(ppfVar13 + 4)];
      pcStack_4db8 = (code *)0x11c498;
      sVar5 = strlen((char *)ppfVar33);
      pcStack_4db8 = (code *)0x11c4a7;
      pfVar37 = pfVar9;
      fVar2 = fdb_del_kv(pfVar9,ppfVar33,sVar5 + 1);
      iVar4 = (int)pfVar37;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c680;
      uVar14 = (int)uVar27 + 1;
      uVar27 = (ulong)uVar14;
    } while (uVar14 != 10);
    ppfVar13 = (fdb_kvs_handle **)((long)ppfVar13 + 1);
  } while (ppfVar13 != (fdb_kvs_handle **)0x400);
  pcVar31 = (char *)0x0;
  do {
    pfVar37 = apfStack_4da0[(long)pcVar31];
    if (((ulong)pcVar31 & 1) == 0) {
      pcStack_4db8 = (code *)0x11c4d5;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar37,'\0');
      iVar4 = (int)pfVar37;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c6ad;
    }
    else {
      pcStack_4db8 = (code *)0x11c4e8;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar37,'\x01');
      iVar4 = (int)pfVar37;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c6b2;
    }
    pcVar31 = (char *)((long)pcVar31 + 1);
  } while (pcVar31 != (char *)0x8);
  ppfVar33 = (fdb_kvs_handle **)0xffffffffffffffc0;
  pcVar31 = (char *)(apfStack_4a30 + 0x20);
  do {
    pcStack_4db8 = (code *)0x11c515;
    ppfVar26 = (fdb_kvs_handle **)pcVar31;
    fVar2 = fdb_rollback((fdb_kvs_handle **)pcVar31,10);
    iVar4 = (int)ppfVar26;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c68a;
    ppfVar33 = ppfVar33 + 8;
    pcVar31 = (char *)((long)pcVar31 + 0x200);
  } while (ppfVar33 < (fdb_kvs_handle **)0x3c0);
  ppfVar13 = apfStack_4da0;
  pcVar31 = "kvs%d";
  ppfVar33 = apfStack_4d30;
  pfVar9 = (fdb_kvs_handle *)0x0;
  do {
    pfVar37 = apfStack_4a30[(long)&pfVar9->op_stats];
    pcStack_4db8 = (code *)0x11c555;
    fVar2 = fdb_kvs_close(pfVar37);
    iVar4 = (int)pfVar37;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c694;
    pcStack_4db8 = (code *)0x11c56d;
    sprintf((char *)ppfVar33,"kvs%d",(ulong)pfVar9 & 0xffffffff);
    pfVar37 = *ppfVar13;
    pcStack_4db8 = (code *)0x11c579;
    fVar2 = fdb_kvs_remove((fdb_file_handle *)pfVar37,(char *)ppfVar33);
    iVar4 = (int)pfVar37;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c68f;
    pfVar9 = (fdb_kvs_handle *)&(pfVar9->config).wal_threshold;
    ppfVar13 = ppfVar13 + 1;
  } while (pfVar9 != (fdb_kvs_handle *)0x400);
  pcVar31 = (char *)0x0;
  do {
    pfVar37 = apfStack_4da0[(long)pcVar31];
    if (((ulong)pcVar31 & 1) == 0) {
      pcStack_4db8 = (code *)0x11c5a5;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar37,'\0');
      iVar4 = (int)pfVar37;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c6b7;
    }
    else {
      pcStack_4db8 = (code *)0x11c5b8;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar37,'\x01');
      iVar4 = (int)pfVar37;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c6bc;
    }
    pcVar31 = (char *)((long)pcVar31 + 1);
  } while (pcVar31 != (char *)0x8);
  pcVar31 = "mvcc_test_compact%d";
  ppfVar33 = apfStack_4d30;
  pfVar9 = (fdb_kvs_handle *)0x0;
  do {
    pcStack_4db8 = (code *)0x11c5eb;
    sprintf((char *)ppfVar33,"mvcc_test_compact%d",(ulong)pfVar9 & 0xffffffff);
    pfVar37 = apfStack_4da0[(long)pfVar9];
    pcStack_4db8 = (code *)0x11c5f8;
    fVar2 = fdb_compact((fdb_file_handle *)pfVar37,(char *)ppfVar33);
    iVar4 = (int)pfVar37;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c699;
    pfVar9 = (fdb_kvs_handle *)&(pfVar9->kvs_config).field_0x1;
  } while (pfVar9 != (fdb_kvs_handle *)0x8);
  pcVar31 = (char *)0x0;
  pcStack_4db8 = (code *)0x11c612;
  fdb_doc_free((fdb_doc *)0x0);
  while( true ) {
    pfVar37 = apfStack_4da0[(long)pcVar31];
    pcStack_4db8 = (code *)0x11c61c;
    fVar2 = fdb_close((fdb_file_handle *)pfVar37);
    iVar4 = (int)pfVar37;
    if (fVar2 != FDB_RESULT_SUCCESS) break;
    pcVar31 = (char *)((long)pcVar31 + 1);
    if (pcVar31 == (char *)0x8) {
      pcStack_4db8 = (code *)0x11c62e;
      fdb_shutdown();
      pcStack_4db8 = (code *)0x11c633;
      memleak_end();
      pcVar20 = "%s PASSED\n";
      if (rollback_drop_multi_files_kvs_test()::__test_pass != '\0') {
        pcVar20 = "%s FAILED\n";
      }
      pcStack_4db8 = (code *)0x11c664;
      fprintf(_stderr,pcVar20,"open multi files kvs test");
      return;
    }
  }
LAB_0011c69e:
  pcStack_4db8 = (code *)0x11c6a3;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6a3:
  pcStack_4db8 = (code *)0x11c6a8;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6a8:
  pcStack_4db8 = (code *)0x11c6ad;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6ad:
  pcStack_4db8 = (code *)0x11c6b2;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6b2:
  pcStack_4db8 = (code *)0x11c6b7;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6b7:
  pcStack_4db8 = (code *)0x11c6bc;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6bc:
  pcStack_4db8 = rollback_without_seqtree;
  rollback_drop_multi_files_kvs_test();
  pcStack_52c0 = (code *)0x11c6e3;
  ppfStack_4de0 = (fdb_kvs_handle **)pcVar31;
  ppfStack_4dd8 = ppfVar13;
  pfStack_4dd0 = (fdb_kvs_handle *)pcVar20;
  ppfStack_4dc8 = ppfVar33;
  pfStack_4dc0 = pfVar9;
  pcStack_4db8 = (code *)uVar27;
  gettimeofday(&tStack_5238,(__timezone_ptr_t)0x0);
  pcStack_52c0 = (code *)0x11c6e8;
  memleak_start();
  pcStack_52c0 = (code *)0x11c6f8;
  fdb_get_default_config();
  pcStack_52c0 = (code *)0x11c702;
  fdb_get_default_kvs_config();
  fStack_4ed8.flags = 1;
  fStack_4ed8.block_reusing_threshold = 0;
  fStack_4ed8.seqtree_opt = 0;
  pcStack_52c0 = (code *)0x11c728;
  fStack_4ed8.multi_kv_instances = (bool)(char)iVar4;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_52c0 = (code *)0x11c73c;
  fdb_open((fdb_file_handle **)&pfStack_52a8,"./mvcc_test1",(fdb_config *)(acStack_4fd8 + 0x100));
  iStack_5284 = iVar4;
  if (iVar4 == 0) {
    pcStack_52c0 = (code *)0x11c7a8;
    fdb_kvs_open_default((fdb_file_handle *)pfStack_52a8,apfStack_5278,&fStack_5258);
    pcVar20 = (char *)0x1;
  }
  else {
    ppfVar13 = apfStack_5278;
    uVar27 = 0;
    do {
      pcStack_52c0 = (code *)0x11c76d;
      sprintf(acStack_5240,"kv%d",uVar27 & 0xffffffff);
      pcStack_52c0 = (code *)0x11c780;
      fdb_kvs_open((fdb_file_handle *)pfStack_52a8,ppfVar13,acStack_5240,&fStack_5258);
      uVar27 = uVar27 + 1;
      ppfVar13 = ppfVar13 + 1;
    } while (uVar27 != 3);
    pcVar20 = (char *)0x3;
  }
  uStack_52ac = 0;
  do {
    uVar27 = 0;
    do {
      pcStack_52c0 = (code *)0x11c7d4;
      sprintf(acStack_50d8,"key%d",uVar27 & 0xffffffff);
      pcStack_52c0 = (code *)0x11c7f5;
      sprintf(acStack_5228,"meta-%d-%d",(ulong)uStack_52ac,uVar27 & 0xffffffff);
      pcStack_52c0 = (code *)0x11c814;
      sprintf(acStack_4fd8,"body-%d-%d",(ulong)uStack_52ac,uVar27 & 0xffffffff);
      doc = (btree *)(&bStack_5128.ksize + uVar27 * 8);
      pcStack_52c0 = (code *)0x11c827;
      sVar5 = strlen(acStack_50d8);
      pcStack_52c0 = (code *)0x11c837;
      metalen._M_i = strlen(acStack_5228);
      pcStack_52c0 = (code *)0x11c842;
      sVar6 = strlen(acStack_4fd8);
      pcStack_52c0 = (code *)0x11c867;
      fdb_doc_create((fdb_doc **)doc,acStack_50d8,sVar5,acStack_5228,metalen._M_i,acStack_4fd8,sVar6
                    );
      pfVar9 = (fdb_kvs_handle *)0x0;
      do {
        pcStack_52c0 = (code *)0x11c878;
        fdb_set(apfStack_5278[(long)pfVar9],*(fdb_doc **)doc);
        pfVar9 = (fdb_kvs_handle *)((long)pfVar9 + 1);
      } while ((fdb_kvs_handle *)pcVar20 != pfVar9);
      pcStack_52c0 = (code *)0x11c88d;
      fdb_doc_free(*(fdb_doc **)(&bStack_5128.ksize + uVar27 * 8));
      uVar27 = uVar27 + 1;
    } while (uVar27 != 10);
    pcStack_52c0 = (code *)0x11c8b1;
    fdb_commit((fdb_file_handle *)pfStack_52a8,~(byte)uStack_52ac & 1);
    uStack_52ac = uStack_52ac + 1;
    pcVar31 = (char *)(ulong)uStack_52ac;
  } while (uStack_52ac != 5);
  pcStack_52c0 = (code *)0x11c8d4;
  fVar2 = fdb_get_all_snap_markers((fdb_file_handle *)pfStack_52a8,&pfStack_5290,&uStack_5260);
  pfVar37 = (fdb_kvs_handle *)0xa;
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_52c0 = (code *)0x11c8f3;
    fVar2 = fdb_rollback(apfStack_5278,(pfStack_5290[3].kvs_markers)->seqnum);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cbd7;
    pfStack_52a0 = (fdb_kvs_handle *)0x0;
    pcVar31 = acStack_4fd8;
    pfVar37 = (fdb_kvs_handle *)0x0;
    do {
      pcStack_52c0 = (code *)0x11c928;
      fVar2 = fdb_snapshot_open(apfStack_5278[(long)pfVar37],&pfStack_5280,0xffffffffffffffff);
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011cbb9:
        pcStack_52c0 = (code *)0x11cbbe;
        rollback_without_seqtree();
LAB_0011cbbe:
        pcStack_52c0 = (code *)0x11cbc3;
        rollback_without_seqtree();
LAB_0011cbc3:
        pcStack_52c0 = (code *)0x11cbc8;
        rollback_without_seqtree();
LAB_0011cbc8:
        pcStack_52c0 = (code *)0x11cbcd;
        rollback_without_seqtree();
        goto LAB_0011cbcd;
      }
      pcStack_52c0 = (code *)0x11c950;
      fVar2 = fdb_iterator_init(pfStack_5280,&pfStack_5298,(void *)0x0,0,(void *)0x0,0,0);
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011cbb4:
        pcStack_52c0 = (code *)0x11cbb9;
        rollback_without_seqtree();
        goto LAB_0011cbb9;
      }
      metalen._M_i = 0;
      do {
        pcStack_52c0 = (code *)0x11c96a;
        fVar2 = fdb_iterator_get(pfStack_5298,(fdb_doc **)&pfStack_52a0);
        if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011cb8f:
          pcStack_52c0 = (code *)0x11cb94;
          rollback_without_seqtree();
LAB_0011cb94:
          pcStack_52c0 = (code *)0x11cba4;
          rollback_without_seqtree();
LAB_0011cba4:
          pcStack_52c0 = (code *)0x11cbb4;
          rollback_without_seqtree();
          goto LAB_0011cbb4;
        }
        pcStack_52c0 = (code *)0x11c98b;
        sprintf(acStack_50d8,"key%d",metalen._M_i);
        if (pfVar37 == (fdb_kvs_handle *)0x0) {
          pcStack_52c0 = (code *)0x11c9da;
          sprintf(acStack_5228,"meta-1-%d",metalen._M_i);
          pcStack_52c0 = (code *)0x11c9ee;
          sprintf(pcVar31,"body-1-%d",metalen._M_i);
        }
        else {
          pcStack_52c0 = (code *)0x11c9ae;
          sprintf(acStack_5228,"meta-%d-%d",4,metalen._M_i);
          pcStack_52c0 = (code *)0x11c9c7;
          sprintf(pcVar31,"body-%d-%d",4);
        }
        pfVar9 = pfStack_52a0;
        doc = (btree *)pfStack_52a0->op_stats;
        pcStack_52c0 = (code *)0x11ca0a;
        iVar4 = bcmp(doc,acStack_50d8,*(size_t *)&pfStack_52a0->kvs_config);
        if (iVar4 != 0) {
          pcStack_52c0 = (code *)0x11cb8f;
          rollback_without_seqtree();
          goto LAB_0011cb8f;
        }
        doc = pfVar9->staletree;
        pcStack_52c0 = (code *)0x11ca2a;
        iVar4 = bcmp(doc,acStack_5228,(size_t)(pfVar9->kvs_config).custom_cmp);
        if (iVar4 != 0) goto LAB_0011cba4;
        doc = (pfVar9->field_6).seqtree;
        pcStack_52c0 = (code *)0x11ca45;
        iVar4 = bcmp(doc,pcVar31,(size_t)(pfVar9->kvs_config).custom_cmp_param);
        if (iVar4 != 0) goto LAB_0011cb94;
        pcStack_52c0 = (code *)0x11ca55;
        fdb_doc_free((fdb_doc *)pfVar9);
        pfStack_52a0 = (fdb_kvs_handle *)0x0;
        uVar14 = (int)metalen._M_i + 1;
        metalen._M_i = (__int_type)uVar14;
        pcStack_52c0 = (code *)0x11ca6b;
        fVar2 = fdb_iterator_next(pfStack_5298);
      } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
      if (uVar14 != 10) goto LAB_0011cbbe;
      pcStack_52c0 = (code *)0x11ca88;
      fVar2 = fdb_iterator_close(pfStack_5298);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cbc3;
      pcStack_52c0 = (code *)0x11ca9a;
      fVar2 = fdb_kvs_close(pfStack_5280);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cbc8;
      pfVar37 = (fdb_kvs_handle *)&(pfVar37->kvs_config).field_0x1;
    } while (pfVar37 != (fdb_kvs_handle *)pcVar20);
    pcVar31 = (char *)0x0;
    do {
      pcStack_52c0 = (code *)0x11caba;
      fVar2 = fdb_kvs_close(apfStack_5278[(long)pcVar31]);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cbcd;
      pcVar31 = pcVar31 + 1;
    } while (pcVar20 != pcVar31);
    pcStack_52c0 = (code *)0x11cadd;
    fVar2 = fdb_rollback_all((fdb_file_handle *)pfStack_52a8,pfStack_5290[3].marker);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cbdc;
    pcStack_52c0 = (code *)0x11caf4;
    fVar2 = fdb_free_snap_markers(pfStack_5290,uStack_5260);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_52c0 = (code *)0x11cb06;
      fdb_close((fdb_file_handle *)pfStack_52a8);
      pcStack_52c0 = (code *)0x11cb0b;
      fdb_shutdown();
      pcStack_52c0 = (code *)0x11cb10;
      memleak_end();
      pcVar20 = "single kv mode:";
      if ((char)iStack_5284 != '\0') {
        pcVar20 = "multiple kv mode:";
      }
      pcStack_52c0 = (code *)0x11cb40;
      sprintf(acStack_4fd8,"rollback without seqtree in %s",pcVar20);
      pcVar20 = "%s PASSED\n";
      if (rollback_without_seqtree(bool)::__test_pass != '\0') {
        pcVar20 = "%s FAILED\n";
      }
      pcStack_52c0 = (code *)0x11cb6d;
      fprintf(_stderr,pcVar20,acStack_4fd8);
      return;
    }
  }
  else {
LAB_0011cbd2:
    pcStack_52c0 = (code *)0x11cbd7;
    rollback_without_seqtree();
LAB_0011cbd7:
    pcStack_52c0 = (code *)0x11cbdc;
    rollback_without_seqtree();
LAB_0011cbdc:
    pcStack_52c0 = (code *)0x11cbe1;
    rollback_without_seqtree();
  }
  pcStack_52c0 = tx_crash_recover_test;
  rollback_without_seqtree();
  pfStack_5498 = (fdb_kvs_handle *)0x11cc03;
  pcStack_52e8 = pcVar31;
  aStack_52e0.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)metalen._M_i;
  pbStack_52d8 = doc;
  pfStack_52d0 = pfVar9;
  pfStack_52c8 = pfVar37;
  pcStack_52c0 = (code *)pcVar20;
  gettimeofday(&tStack_5438,(__timezone_ptr_t)0x0);
  pfStack_5498 = (fdb_kvs_handle *)0x11cc08;
  memleak_start();
  pfStack_5498 = (fdb_kvs_handle *)0x11cc14;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcVar20 = auStack_5428 + 0x48;
  pfStack_5498 = (fdb_kvs_handle *)0x11cc24;
  fdb_get_default_config();
  pfStack_5498 = (fdb_kvs_handle *)0x11cc36;
  fVar2 = fdb_open(&pfStack_5490,"./mvcc_test2",(fdb_config *)pcVar20);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcVar20 = auStack_5428;
    pfStack_5498 = (fdb_kvs_handle *)0x11cc4b;
    fdb_get_default_kvs_config();
    pbStack_5440 = (btreeblk_handle *)auStack_5428._16_8_;
    pfStack_5450 = (filemgr *)auStack_5428._0_8_;
    pdStack_5448 = (docio_handle *)auStack_5428._8_8_;
    pfStack_5498 = (fdb_kvs_handle *)0x11cc6c;
    fVar2 = fdb_kvs_open_default(pfStack_5490,&pfStack_5488,(fdb_kvs_config *)&pfStack_5450);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf77;
    pfStack_5498 = (fdb_kvs_handle *)0x11cc82;
    fVar2 = fdb_begin_transaction(pfStack_5490,'\x03');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf7c;
    pcVar20 = "key%d";
    pfVar9 = (fdb_kvs_handle *)acStack_547f;
    pfVar37 = (fdb_kvs_handle *)0x1565bd;
    uVar27 = 0;
    do {
      pfStack_5498 = (fdb_kvs_handle *)0x11ccae;
      sprintf((char *)pfVar9,"key%d",uVar27);
      handle = pfStack_5488;
      pfStack_5498 = (fdb_kvs_handle *)0x11ccbb;
      sVar5 = strlen((char *)pfVar9);
      pfStack_5498 = (fdb_kvs_handle *)0x11ccd2;
      fVar2 = fdb_set_kv(handle,pfVar9,sVar5,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_5498 = (fdb_kvs_handle *)0x11cf63;
        tx_crash_recover_test();
        goto LAB_0011cf63;
      }
      uVar14 = (int)uVar27 + 1;
      uVar27 = (ulong)uVar14;
    } while (uVar14 != 10);
    pfStack_5498 = (fdb_kvs_handle *)0x11ccef;
    fVar2 = fdb_end_transaction(pfStack_5490,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf81;
    pfStack_5498 = (fdb_kvs_handle *)0x11cd07;
    fdb_compact(pfStack_5490,"./mvcc_test3");
    pfStack_5498 = (fdb_kvs_handle *)0x11cd15;
    fVar2 = fdb_begin_transaction(pfStack_5490,'\x03');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf86;
    pcVar20 = "key%d";
    pfVar9 = (fdb_kvs_handle *)acStack_547f;
    uVar14 = 0;
    do {
      pfStack_5498 = (fdb_kvs_handle *)0x11cd3a;
      sprintf((char *)pfVar9,"key%d",(ulong)uVar14);
      pfVar37 = pfStack_5488;
      pfStack_5498 = (fdb_kvs_handle *)0x11cd47;
      sVar5 = strlen((char *)pfVar9);
      pfStack_5498 = (fdb_kvs_handle *)0x11cd55;
      fVar2 = fdb_del_kv(pfVar37,pfVar9,sVar5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf63;
      uVar14 = uVar14 + 1;
    } while (uVar14 != 10);
    pfStack_5498 = (fdb_kvs_handle *)0x11cd72;
    fVar2 = fdb_get_file_info(pfStack_5490,(fdb_file_info *)auStack_5428);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf8b;
    pcVar20 = (char *)((ulong)auStack_5428._40_8_ / (ulong)uStack_53dc);
    pfStack_5498 = (fdb_kvs_handle *)0x11cd9a;
    fdb_close(pfStack_5490);
    pfStack_5498 = (fdb_kvs_handle *)0x11cd9f;
    fdb_shutdown();
    pfStack_5498 = (fdb_kvs_handle *)0x11cdbe;
    iVar4 = _disk_dump("./mvcc_test3",(ulong)uStack_53dc * (long)pcVar20,
                       (ulong)((uStack_53dc >> 2) + uStack_53dc * 2));
    if (iVar4 < 0) goto LAB_0011cf90;
    pfStack_5498 = (fdb_kvs_handle *)0x11cde8;
    iVar4 = _disk_dump("./mvcc_test2",((long)pcVar20 * 4 + 8) * (ulong)uStack_53dc,
                       (ulong)(uStack_53dc >> 2));
    if (iVar4 < 0) goto LAB_0011cf95;
    pfStack_5498 = (fdb_kvs_handle *)0x11ce07;
    fVar2 = fdb_open(&pfStack_5490,"./mvcc_test3",(fdb_config *)(auStack_5428 + 0x48));
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf9a;
    pcVar20 = (char *)&pfStack_5470;
    pfStack_5498 = (fdb_kvs_handle *)0x11ce1c;
    fdb_get_default_kvs_config();
    pbStack_5440 = pbStack_5460;
    pfStack_5450 = pfStack_5470;
    pdStack_5448 = pdStack_5468;
    pfStack_5498 = (fdb_kvs_handle *)0x11ce3d;
    fVar2 = fdb_kvs_open_default(pfStack_5490,&pfStack_5488,(fdb_kvs_config *)&pfStack_5450);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf9f;
    pfStack_5498 = (fdb_kvs_handle *)0x11ce53;
    fVar2 = fdb_begin_transaction(pfStack_5490,'\x03');
    if (fVar2 == FDB_RESULT_SUCCESS) {
      uVar14 = 0;
      do {
        pfStack_5498 = (fdb_kvs_handle *)0x11ce78;
        sprintf(acStack_547f,"key%d",(ulong)uVar14);
        pfVar37 = pfStack_5488;
        pfStack_5498 = (fdb_kvs_handle *)0x11ce85;
        sVar5 = strlen(acStack_547f);
        pfStack_5498 = (fdb_kvs_handle *)0x11ce93;
        fVar2 = fdb_del_kv(pfVar37,acStack_547f,sVar5);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf68;
        uVar14 = uVar14 + 1;
      } while (uVar14 != 10);
      pfStack_5498 = (fdb_kvs_handle *)0x11ceab;
      fdb_abort_transaction(pfStack_5490);
      pfVar37 = (fdb_kvs_handle *)&pfStack_5470;
      uVar14 = 0;
      while( true ) {
        pfStack_5498 = (fdb_kvs_handle *)0x11ced2;
        sprintf(acStack_547f,"key%d",(ulong)uVar14);
        pfVar9 = pfStack_5488;
        pfStack_5498 = (fdb_kvs_handle *)0x11cedf;
        sVar5 = strlen(acStack_547f);
        pfStack_5498 = (fdb_kvs_handle *)0x11cef3;
        fVar2 = fdb_get_kv(pfVar9,acStack_547f,sVar5,(void **)pfVar37,&sStack_5458);
        if (fVar2 != FDB_RESULT_SUCCESS) break;
        pfStack_5498 = (fdb_kvs_handle *)0x11cf01;
        free(pfStack_5470);
        uVar14 = uVar14 + 1;
        if (uVar14 == 10) {
          pfStack_5498 = (fdb_kvs_handle *)0x11cf11;
          fdb_close(pfStack_5490);
          pfStack_5498 = (fdb_kvs_handle *)0x11cf16;
          fdb_shutdown();
          pfStack_5498 = (fdb_kvs_handle *)0x11cf1b;
          memleak_end();
          pcVar20 = "%s PASSED\n";
          if (tx_crash_recover_test()::__test_pass != '\0') {
            pcVar20 = "%s FAILED\n";
          }
          pfStack_5498 = (fdb_kvs_handle *)0x11cf4c;
          fprintf(_stderr,pcVar20,"crash recover test");
          return;
        }
      }
LAB_0011cf6d:
      pfVar9 = (fdb_kvs_handle *)acStack_547f;
      pcVar20 = "key%d";
      pfStack_5498 = (fdb_kvs_handle *)0x11cf72;
      tx_crash_recover_test();
      goto LAB_0011cf72;
    }
  }
  else {
LAB_0011cf72:
    pfStack_5498 = (fdb_kvs_handle *)0x11cf77;
    tx_crash_recover_test();
LAB_0011cf77:
    pfStack_5498 = (fdb_kvs_handle *)0x11cf7c;
    tx_crash_recover_test();
LAB_0011cf7c:
    pfStack_5498 = (fdb_kvs_handle *)0x11cf81;
    tx_crash_recover_test();
LAB_0011cf81:
    pfStack_5498 = (fdb_kvs_handle *)0x11cf86;
    tx_crash_recover_test();
LAB_0011cf86:
    pfStack_5498 = (fdb_kvs_handle *)0x11cf8b;
    tx_crash_recover_test();
LAB_0011cf8b:
    pfStack_5498 = (fdb_kvs_handle *)0x11cf90;
    tx_crash_recover_test();
LAB_0011cf90:
    pfStack_5498 = (fdb_kvs_handle *)0x11cf95;
    tx_crash_recover_test();
LAB_0011cf95:
    pfStack_5498 = (fdb_kvs_handle *)0x11cf9a;
    tx_crash_recover_test();
LAB_0011cf9a:
    pfStack_5498 = (fdb_kvs_handle *)0x11cf9f;
    tx_crash_recover_test();
LAB_0011cf9f:
    pfStack_5498 = (fdb_kvs_handle *)0x11cfa4;
    tx_crash_recover_test();
  }
  pfStack_5498 = (fdb_kvs_handle *)drop_kv_on_snap_iterator_test;
  tx_crash_recover_test();
  pfStack_54a8 = (fdb_config *)pcVar20;
  pfStack_54a0 = pfVar9;
  pfStack_5498 = pfVar37;
  gettimeofday(&tStack_55c8,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  pfStack_55d8 = (fdb_doc *)0x0;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_open(&pfStack_55e8,"./mvcc_test1",&fStack_55a0);
  fdb_kvs_open_default(pfStack_55e8,&pfStack_55d0,&fStack_55b8);
  fdb_kvs_open(pfStack_55e8,&pfStack_55f0,"kv",&fStack_55b8);
  fVar2 = fdb_set_kv(pfStack_55f0,"a",1,(void *)0x0,0);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_set_kv(pfStack_55f0,"b",1,(void *)0x0,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1c2;
    fdb_commit(pfStack_55e8,'\x01');
    fVar2 = fdb_snapshot_open(pfStack_55f0,&pfStack_55f8,2);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1c9;
    fVar2 = fdb_iterator_init(pfStack_55f8,&pfStack_55e0,(void *)0x0,0,(void *)0x0,0,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1ce;
    fVar2 = fdb_kvs_close(pfStack_55f8);
    if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011d1d3;
    fVar2 = fdb_kvs_close(pfStack_55f0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1d8;
    fVar2 = fdb_kvs_remove(pfStack_55e8,"kv");
    if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011d1dd;
    fVar2 = fdb_iterator_get(pfStack_55e0,&pfStack_55d8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1e2;
    fdb_doc_free(pfStack_55d8);
    fVar2 = fdb_iterator_close(pfStack_55e0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1e7;
    fVar2 = fdb_kvs_close(pfStack_55f8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1ec;
    fVar2 = fdb_kvs_close(pfStack_55d0);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fVar2 = fdb_close(pfStack_55e8);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        fdb_shutdown();
        memleak_end();
        pcVar20 = "%s PASSED\n";
        if (drop_kv_on_snap_iterator_test()::__test_pass != '\0') {
          pcVar20 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar20,"drop kv other handle test");
        return;
      }
      goto LAB_0011d1f6;
    }
  }
  else {
    drop_kv_on_snap_iterator_test();
LAB_0011d1c2:
    drop_kv_on_snap_iterator_test();
LAB_0011d1c9:
    drop_kv_on_snap_iterator_test();
LAB_0011d1ce:
    drop_kv_on_snap_iterator_test();
LAB_0011d1d3:
    drop_kv_on_snap_iterator_test();
LAB_0011d1d8:
    drop_kv_on_snap_iterator_test();
LAB_0011d1dd:
    drop_kv_on_snap_iterator_test();
LAB_0011d1e2:
    drop_kv_on_snap_iterator_test();
LAB_0011d1e7:
    drop_kv_on_snap_iterator_test();
LAB_0011d1ec:
    drop_kv_on_snap_iterator_test();
  }
  drop_kv_on_snap_iterator_test();
LAB_0011d1f6:
  drop_kv_on_snap_iterator_test();
  concurrent_writer_iterator_test();
  in_memory_snapshot_cleanup_test();
  drop_kv_on_snap_iterator_test();
  rollback_secondary_kvs();
  multi_version_test();
  crash_recovery_test(true);
  crash_recovery_test(false);
  snapshot_test();
  in_memory_snapshot_rollback_test();
  in_memory_snapshot_test();
  in_memory_snapshot_on_dirty_hbtrie_test();
  in_memory_snapshot_compaction_test();
  snapshot_clone_test();
  snapshot_parallel_clone_test();
  snapshot_stats_test();
  snapshot_with_uncomitted_data_test();
  snapshot_markers_in_file_test(true);
  snapshot_markers_in_file_test(false);
  snapshot_with_deletes_test();
  snapshot_without_seqtree(true);
  snapshot_without_seqtree(false);
  rollback_during_ops_test((void *)0x0);
  rollback_forward_seqnum();
  rollback_test(false);
  rollback_test(true);
  rollback_and_snapshot_test();
  rollback_ncommits();
  transaction_test();
  transaction_simple_api_test();
  transaction_in_memory_snapshot_test();
  rollback_prior_to_ops(true);
  rollback_prior_to_ops(false);
  snapshot_concurrent_compaction_test();
  rollback_to_zero_test(true);
  rollback_to_zero_test(false);
  rollback_to_zero_after_compact_test(false);
  rollback_to_zero_after_compact_test(true);
  rollback_all_test(true);
  rollback_all_test(false);
  rollback_to_wal_test(true);
  rollback_to_wal_test(false);
  rollback_drop_multi_files_kvs_test();
  rollback_without_seqtree(true);
  rollback_without_seqtree(false);
  tx_crash_recover_test();
  auto_compaction_snapshots_test();
  return;
}

Assistant:

void snapshot_concurrent_compaction_test()
{
    TEST_INIT();
    memleak_start();

    int i, j, idx, r;
    int n = 100;
    int commit_term = n/2;
    char keybuf[256], bodybuf[256];
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_status s;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    struct cb_snapshot_args cb_args;

    memset(&cb_args, 0x0, sizeof(struct cb_snapshot_args));
    fconfig.wal_threshold = 128;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_cb = cb_snapshot;
    fconfig.compaction_cb_ctx = &cb_args;
    fconfig.compaction_cb_mask = FDB_CS_BEGIN |
                                 FDB_CS_END;

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    // open db
    fdb_open(&dbfile, "./mvcc_test1", &fconfig);
    fdb_kvs_open(dbfile, &db, "db", &kvs_config);
    cb_args.handle = db;

    // write docs & commit for each n/2 doc updates
    for (i=0;i<n;++i){
        idx = i;
        j = i/commit_term;
        sprintf(keybuf, "key%04d", idx);
        sprintf(bodybuf, "body%04d_update%d", idx, j);
        s = fdb_set_kv(db, keybuf, strlen(keybuf)+1,
                           bodybuf, strlen(bodybuf)+1);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        if ((i+1)%commit_term == 0) {
            s = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
            TEST_CHK(s == FDB_RESULT_SUCCESS);
        }
    }
    cb_args.ndocs = n;
    cb_args.nupdates = 2;
    cb_args.niterations = 10;

    _snapshot_check(db, cb_args.ndocs, cb_args.nupdates);

    s = fdb_compact(dbfile, "./mvcc_test2");
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    fdb_close(dbfile);
    fdb_shutdown();
    memleak_end();
    TEST_RESULT("snapshot with concurrent compaction test");
}